

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O1

int read_file(coda_product *product)

{
  ulong index;
  undefined4 uVar1;
  char cVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 field_type;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined7 uVar13;
  char cVar14;
  undefined3 uVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  coda_mem_data *pcVar23;
  coda_type_record *pcVar24;
  coda_type_record_field *pcVar25;
  coda_mem_array *pcVar26;
  size_t sVar27;
  coda_mem_special *pcVar28;
  coda_type_array *pcVar29;
  coda_mem_record *pcVar30;
  char *pcVar31;
  undefined1 field_type_00 [8];
  char *message;
  undefined8 *puVar32;
  ulong uVar33;
  long in_FS_OFFSET;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  double double_value;
  int64_t int_value;
  char line [1000];
  undefined8 uStack_5f0;
  char local_5e8;
  char cStack_5e7;
  char cStack_5e6;
  char cStack_5e5;
  char cStack_5e4;
  char cStack_5e3;
  undefined1 uStack_5e2;
  undefined1 uStack_5e1;
  undefined7 uStack_5e0;
  char cStack_5d9;
  uint5 local_5d8;
  undefined3 uStack_5d3;
  undefined3 uStack_5d0;
  undefined5 uStack_5cd;
  undefined3 uStack_5c8;
  undefined5 uStack_5c5;
  undefined1 uStack_5c0;
  undefined2 uStack_5bf;
  undefined1 uStack_5bd;
  undefined4 uStack_5b8;
  undefined8 uStack_5b4;
  undefined1 local_5ac;
  int32_t local_5a0;
  undefined4 uStack_59c;
  int32_t local_598 [2];
  undefined1 local_590 [48];
  undefined1 local_560 [12];
  undefined4 uStack_554;
  coda_mem_array *local_550;
  int iStack_548;
  undefined1 local_540 [16];
  undefined1 local_530 [12];
  undefined4 uStack_524;
  coda_mem_array *local_520;
  int iStack_518;
  undefined1 local_510 [16];
  undefined1 local_500 [12];
  undefined4 uStack_4f4;
  coda_mem_array *local_4f0;
  int iStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  double dStack_4b8;
  char local_4b0;
  char cStack_4af;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  coda_mem_array *pcStack_480;
  undefined1 local_478 [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  char local_448 [3];
  char cStack_445;
  char cStack_444;
  char acStack_443 [9];
  char acStack_43a [2];
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined2 uStack_418;
  char cStack_416;
  undefined4 uStack_415;
  char cStack_411;
  undefined2 local_410;
  char cStack_40e;
  undefined1 uStack_40d;
  char local_40c;
  char cStack_40b;
  char cStack_40a;
  char cStack_409;
  char cStack_408;
  char cStack_407;
  char cStack_406;
  char cStack_405;
  char cStack_404;
  char cStack_403;
  char cStack_402;
  char cStack_401;
  char cStack_400;
  char cStack_3ff;
  char cStack_3fe;
  char cStack_3fd;
  char local_3fc;
  char cStack_3fb;
  char cStack_3fa;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_590._0_8_ = (FILE *)0x0;
  local_590._16_8_ = (coda_mem_record *)0x0;
  local_590._24_4_ = 0;
  local_590._32_16_ = (undefined1  [16])0x0;
  local_560 = SUB1612((undefined1  [16])0x0,0);
  uStack_554 = 0;
  local_550 = (coda_mem_array *)0x0;
  iStack_548 = 0;
  local_540 = (undefined1  [16])0x0;
  local_530 = SUB1612((undefined1  [16])0x0,0);
  uStack_524 = 0;
  local_520 = (coda_mem_array *)0x0;
  iStack_518 = 0;
  local_510 = (undefined1  [16])0x0;
  local_500 = SUB1612((undefined1  [16])0x0,0);
  uStack_4f4 = 0;
  local_4f0 = (coda_mem_array *)0x0;
  iStack_4e8 = 0;
  local_4e0 = (undefined1  [16])0x0;
  local_4d0 = (undefined1  [16])0x0;
  _local_4c0 = (undefined1  [16])0x0;
  local_4b0 = ' ';
  cStack_4af = ' ';
  local_4a8 = (undefined1  [16])0x0;
  local_498 = (undefined1  [16])0x0;
  _local_488 = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  uStack_5f0 = 0x11b615;
  local_590._8_8_ = product;
  local_590._0_8_ = fopen(product->filename,"r");
  if ((FILE *)local_590._0_8_ == (FILE *)0x0) {
    uStack_5f0 = 0x11b688;
    coda_set_error(-0x15,"could not open file %s",product->filename);
    return -1;
  }
  uStack_5f0 = 0x11b627;
  lVar21 = ftell((FILE *)local_590._0_8_);
  local_4a8._0_8_ = local_4a8._0_8_ + 1;
  uStack_5f0 = 0x11b649;
  local_4a8._8_8_ = lVar21;
  iVar19 = get_line((FILE *)local_590._0_8_,local_448);
  if (iVar19 < 0) goto LAB_0011b6ea;
  if (iVar19 < 0x3d) {
    pcVar31 = (char *)(long)iVar19;
    goto LAB_0011b659;
  }
  auVar67[0] = -((char)_local_3fc == 'T');
  auVar67[1] = -((char)((uint)_local_3fc >> 8) == 'Y');
  auVar67[2] = -((char)((uint)_local_3fc >> 0x10) == 'P');
  auVar67[3] = -((char)((uint)_local_3fc >> 0x18) == 'E');
  auVar67[4] = 0xff;
  auVar67[5] = 0xff;
  auVar67[6] = 0xff;
  auVar67[7] = 0xff;
  auVar67[8] = 0xff;
  auVar67[9] = 0xff;
  auVar67[10] = 0xff;
  auVar67[0xb] = 0xff;
  auVar67[0xc] = 0xff;
  auVar67[0xd] = 0xff;
  auVar67[0xe] = 0xff;
  auVar67[0xf] = 0xff;
  auVar35[0] = -(local_40c == 'R');
  auVar35[1] = -(cStack_40b == 'I');
  auVar35[2] = -(cStack_40a == 'N');
  auVar35[3] = -(cStack_409 == 'E');
  auVar35[4] = -(cStack_408 == 'X');
  auVar35[5] = -(cStack_407 == ' ');
  auVar35[6] = -(cStack_406 == 'V');
  auVar35[7] = -(cStack_405 == 'E');
  auVar35[8] = -(cStack_404 == 'R');
  auVar35[9] = -(cStack_403 == 'S');
  auVar35[10] = -(cStack_402 == 'I');
  auVar35[0xb] = -(cStack_401 == 'O');
  auVar35[0xc] = -(cStack_400 == 'N');
  auVar35[0xd] = -(cStack_3ff == ' ');
  auVar35[0xe] = -(cStack_3fe == '/');
  auVar35[0xf] = -(cStack_3fd == ' ');
  auVar35 = auVar35 & auVar67;
  if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) == 0xffff) {
    uStack_5f0 = 0x11b727;
    lVar22 = coda_ascii_parse_double(local_448,9,(double *)(local_4c0 + 8),0);
    lVar21 = local_4a8._8_8_;
    if (lVar22 < 0) {
LAB_0011dc9c:
      uStack_5f0 = 0x11dcaa;
      coda_add_error_message(" (line: %ld, byte offset: %ld)",local_4a8._0_8_,lVar21);
      goto LAB_0011b6ea;
    }
    local_4b0 = (char)uStack_434;
    uVar20 = uStack_434 & 0xff;
    if (uVar20 == 0x43) {
      lVar21 = 0x470;
      if (((dStack_4b8 == 2.0) && (!NAN(dStack_4b8))) || ((dStack_4b8 == 3.0 && (!NAN(dStack_4b8))))
         ) {
LAB_0011b7f3:
        uStack_5f0 = 0x11b807;
        local_590._16_8_ =
             coda_mem_record_new(*(coda_type_record **)(*(long *)(in_FS_OFFSET + -0x1c8) + lVar21),
                                 (coda_dynamic_type *)0x0);
        uVar1 = uStack_420;
        if (dStack_4b8 != 3.0) {
          uVar1 = 0x47;
        }
        cStack_4af = (char)uVar1;
        if (NAN(dStack_4b8)) {
          cStack_4af = 'G';
        }
        uStack_5f0 = 0x11b852;
        pcVar23 = coda_mem_float_new((coda_type_number *)**(undefined8 **)(in_FS_OFFSET + -0x1c8),
                                     (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                     (float)dStack_4b8);
        uStack_5f0 = 0x11b868;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,"format_version",(coda_dynamic_type *)pcVar23
                   ,0);
        uStack_5f0 = 0x11b889;
        pcVar23 = coda_mem_char_new(*(coda_type_text **)(*(long *)(in_FS_OFFSET + -0x1c8) + 8),
                                    (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                    local_4b0);
        uStack_5f0 = 0x11b89f;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,"file_type",(coda_dynamic_type *)pcVar23,0);
        uStack_5f0 = 0x11b8c0;
        pcVar23 = coda_mem_char_new(*(coda_type_text **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x10),
                                    (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                    cStack_4af);
        uStack_5f0 = 0x11b8d6;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,"satellite_system",
                   (coda_dynamic_type *)pcVar23,0);
        if (local_4b0 == 'N') {
          uStack_5f0 = 0x11cc88;
          pcVar24 = coda_type_record_new(coda_format_rinex);
          local_498._0_8_ = pcVar24;
          uStack_5f0 = 0x11cc9c;
          pcVar25 = coda_type_record_field_new("epoch");
          uStack_5f0 = 0x11ccb7;
          coda_type_record_field_set_type
                    (pcVar25,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x168));
          uStack_5f0 = 0x11ccc7;
          coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar25);
          uStack_5f0 = 0x11ccd3;
          pcVar25 = coda_type_record_field_new("flag");
          uStack_5f0 = 0x11ccee;
          coda_type_record_field_set_type
                    (pcVar25,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x170));
          uStack_5f0 = 0x11ccfe;
          coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar25);
          uStack_5f0 = 0x11cd0a;
          pcVar25 = coda_type_record_field_new("receiver_clock_offset");
          uStack_5f0 = 0x11cd25;
          coda_type_record_field_set_type
                    (pcVar25,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x178));
          uStack_5f0 = 0x11cd35;
          coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar25);
          uStack_5f0 = 0x11cd4c;
          pcVar26 = coda_mem_array_new(*(coda_type_array **)
                                        (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1d0),
                                       (coda_dynamic_type *)0x0);
          local_478._0_8_ = pcVar26;
          uStack_5f0 = 0x11cd6b;
          pcVar26 = coda_mem_array_new(*(coda_type_array **)
                                        (*(long *)(in_FS_OFFSET + -0x1c8) + 0x218),
                                       (coda_dynamic_type *)0x0);
          local_478._8_8_ = pcVar26;
          uStack_5f0 = 0x11cd7d;
          local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
          local_4a8._0_8_ = local_4a8._0_8_ + 1;
          uStack_5f0 = 0x11cd9f;
          uVar20 = get_line((FILE *)local_590._0_8_,local_448);
          if (-1 < (int)uVar20) {
            local_458 = 0x5552202f204d4750;
            uStack_450 = 0x44202f205942204e;
            local_468 = 0x42204e5552202f20;
            uStack_460 = 0x45544144202f2059;
            do {
              pcVar31 = &local_40c;
              if (uVar20 == 0) {
LAB_0011dd07:
                uStack_5f0 = 0x11dd25;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"ionospheric_corr",
                           (coda_dynamic_type *)local_478._0_8_,0);
                field_type = local_478._8_8_;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = local_478._8_8_;
                local_478 = auVar4 << 0x40;
                uStack_5f0 = 0x11dd48;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"time_system_corr",
                           (coda_dynamic_type *)field_type,0);
                local_478._8_8_ = 0;
                uStack_5f0 = 0x11dd5a;
                local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
                local_4a8._0_8_ = local_4a8._0_8_ + 1;
                uStack_5f0 = 0x11dd74;
                iVar19 = coda_mem_record_validate((coda_mem_record *)local_590._16_8_);
                if (iVar19 == 0) {
                  uStack_5f0 = 0x11dd93;
                  local_550 = coda_mem_array_new(*(coda_type_array **)
                                                  (*(long *)(in_FS_OFFSET + -0x1c8) + 0x400),
                                                 (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x11ddb3;
                  local_520 = coda_mem_array_new(*(coda_type_array **)
                                                  (*(long *)(in_FS_OFFSET + -0x1c8) + 0x408),
                                                 (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x11ddce;
                  local_4f0 = coda_mem_array_new(*(coda_type_array **)
                                                  (*(long *)(in_FS_OFFSET + -0x1c8) + 0x410),
                                                 (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x11ddec;
                  pcVar26 = coda_mem_array_new(*(coda_type_array **)
                                                (*(long *)(in_FS_OFFSET + -0x1c8) + 0x418),
                                               (coda_dynamic_type *)0x0);
                  local_4c0 = (undefined1  [8])pcVar26;
                  uStack_5f0 = 0x11ddfb;
                  iVar19 = read_navigation_records((ingest_info *)local_590);
                  if (iVar19 == 0) {
                    puVar32 = (undefined8 *)local_4c0;
                    uStack_5f0 = 0x11de25;
                    pcVar30 = coda_mem_record_new(*(coda_type_record **)
                                                   (*(long *)(in_FS_OFFSET + -0x1c8) + 0x420),
                                                  (coda_dynamic_type *)0x0);
                    uStack_5f0 = 0x11de41;
                    coda_mem_record_add_field
                              (pcVar30,"header",(coda_dynamic_type *)local_590._16_8_,0);
                    local_590._16_8_ = (coda_mem_record *)0x0;
                    uStack_5f0 = 0x11de62;
                    coda_mem_record_add_field(pcVar30,"gps",(coda_dynamic_type *)local_550,0);
                    local_550 = (coda_mem_array *)0x0;
                    uStack_5f0 = 0x11de80;
                    coda_mem_record_add_field(pcVar30,"glonass",(coda_dynamic_type *)local_520,0);
                    local_520 = (coda_mem_array *)0x0;
                    uStack_5f0 = 0x11de9b;
                    coda_mem_record_add_field(pcVar30,"galileo",(coda_dynamic_type *)local_4f0,0);
                    local_4f0 = (coda_mem_array *)0x0;
                    pcVar31 = "sbas";
                    iVar19 = 0;
                    field_type_00 = local_4c0;
                    goto LAB_0011e1eb;
                  }
                }
                break;
              }
              if (uVar20 < 0x3d) goto LAB_0011dcaf;
              auVar55[0] = -(local_40c == (char)local_458);
              auVar55[1] = -(cStack_40b == local_458._1_1_);
              auVar55[2] = -(cStack_40a == local_458._2_1_);
              auVar55[3] = -(cStack_409 == local_458._3_1_);
              auVar55[4] = -(cStack_408 == local_458._4_1_);
              auVar55[5] = -(cStack_407 == local_458._5_1_);
              auVar55[6] = -(cStack_406 == local_458._6_1_);
              auVar55[7] = -(cStack_405 == local_458._7_1_);
              auVar55[8] = -(cStack_404 == (char)uStack_450);
              auVar55[9] = -(cStack_403 == uStack_450._1_1_);
              auVar55[10] = -(cStack_402 == uStack_450._2_1_);
              auVar55[0xb] = -(cStack_401 == uStack_450._3_1_);
              auVar55[0xc] = -(cStack_400 == uStack_450._4_1_);
              auVar55[0xd] = -(cStack_3ff == uStack_450._5_1_);
              auVar55[0xe] = -(cStack_3fe == uStack_450._6_1_);
              auVar55[0xf] = -(cStack_3fd == uStack_450._7_1_);
              auVar86[0] = -(cStack_409 == (char)local_468);
              auVar86[1] = -(cStack_408 == local_468._1_1_);
              auVar86[2] = -(cStack_407 == local_468._2_1_);
              auVar86[3] = -(cStack_406 == local_468._3_1_);
              auVar86[4] = -(cStack_405 == local_468._4_1_);
              auVar86[5] = -(cStack_404 == local_468._5_1_);
              auVar86[6] = -(cStack_403 == local_468._6_1_);
              auVar86[7] = -(cStack_402 == local_468._7_1_);
              auVar86[8] = -(cStack_401 == (char)uStack_460);
              auVar86[9] = -(cStack_400 == uStack_460._1_1_);
              auVar86[10] = -(cStack_3ff == uStack_460._2_1_);
              auVar86[0xb] = -(cStack_3fe == uStack_460._3_1_);
              auVar86[0xc] = -(cStack_3fd == uStack_460._4_1_);
              auVar86[0xd] = -(local_3fc == uStack_460._5_1_);
              auVar86[0xe] = -(cStack_3fb == uStack_460._6_1_);
              auVar86[0xf] = -(cStack_3fa == uStack_460._7_1_);
              auVar86 = auVar86 & auVar55;
              if ((ushort)((ushort)(SUB161(auVar86 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar86 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar86 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar86[0xf] >> 7) << 0xf) == 0xffff) {
                local_5e8 = (char)_local_448;
                cStack_5e7 = (char)((uint)_local_448 >> 8);
                cStack_5e6 = (char)((uint)_local_448 >> 0x10);
                cStack_5e5 = (char)((uint)_local_448 >> 0x18);
                uStack_5e2 = (undefined1)acStack_443._1_2_;
                uStack_5e1 = SUB21(acStack_443._1_2_,1);
                uStack_5e0 = (undefined7)stack0xfffffffffffffbc0;
                cStack_5d9 = (char)((ulong)stack0xfffffffffffffbc0 >> 0x38);
                local_5d8 = (uint5)local_438;
                uStack_5f0 = 0x11cf66;
                sVar27 = strlen(&local_5e8);
                if (0 < (long)sVar27) {
                  lVar21 = sVar27 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
                    lVar21 = lVar21 + -1;
                  } while (1 < lVar21);
                }
                uStack_5f0 = 0x11cf9f;
                pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x1c8) + 0x18),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x11cfb1;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"program",
                           (coda_dynamic_type *)pcVar23,0);
                local_5e8 = (char)uStack_434;
                cStack_5e7 = (char)(uStack_434 >> 8);
                cStack_5e6 = (char)(uStack_434 >> 0x10);
                cStack_5e5 = (char)(uStack_434 >> 0x18);
                cStack_5e4 = (char)uStack_430;
                cStack_5e3 = (char)((uint)uStack_430 >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_430 >> 0x10);
                uStack_5e1 = (undefined1)((uint)uStack_430 >> 0x18);
                uStack_5e0 = (undefined7)CONCAT44(uStack_428,uStack_42c);
                cStack_5d9 = (char)((uint)uStack_428 >> 0x18);
                _local_5d8 = CONCAT44(stack0xfffffffffffffa2c,uStack_424);
                uStack_5f0 = 0x11cfcc;
                sVar27 = strlen(&local_5e8);
                if (0 < (long)sVar27) {
                  lVar21 = sVar27 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
                    lVar21 = lVar21 + -1;
                  } while (1 < lVar21);
                }
                uStack_5f0 = 0x11d005;
                pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x1c8) + 0x20),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x11d01b;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"run_by",(coda_dynamic_type *)pcVar23
                           ,0);
                local_5e8 = (char)uStack_420;
                cStack_5e7 = (char)((uint)uStack_420 >> 8);
                cStack_5e6 = (char)((uint)uStack_420 >> 0x10);
                cStack_5e5 = (char)((uint)uStack_420 >> 0x18);
                cStack_5e4 = (char)uStack_41c;
                cStack_5e3 = (char)((uint)uStack_41c >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_41c >> 0x10);
                uStack_5e1 = uStack_41c._3_1_;
                uStack_5e0 = (undefined7)
                             (CONCAT44(uStack_415,
                                       CONCAT13(cStack_416,CONCAT21(uStack_418,uStack_41c._3_1_)))
                             >> 8);
                cStack_5d9 = '\0';
                uStack_5f0 = 0x11d04d;
                pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x1c8) + 0x30),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x11d064;
                pcVar28 = coda_mem_time_new(*(coda_type_special **)
                                             (*(long *)(in_FS_OFFSET + -0x1c8) + 0x28),
                                            (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar23);
                uStack_5f0 = 0x11d07a;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"datetime",
                           (coda_dynamic_type *)pcVar28,0);
                local_5e8 = (char)local_410;
                cStack_5e7 = (char)((ushort)local_410 >> 8);
                cStack_5e6 = cStack_40e;
                cStack_5e5 = 0;
                uStack_5f0 = 0x11d0ac;
                pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x1c8) + 0x38),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                pcVar31 = "datetime_time_zone";
LAB_0011d0b8:
                uStack_5f0 = 0x11d0c2;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,pcVar31,(coda_dynamic_type *)pcVar23,
                           0);
              }
              else if (CONCAT13(cStack_406,CONCAT12(cStack_407,CONCAT11(cStack_408,cStack_409))) !=
                       0x544e454d ||
                       CONCAT13(cStack_409,CONCAT12(cStack_40a,CONCAT11(cStack_40b,local_40c))) !=
                       0x4d4d4f43) {
                auVar56[0] = -(local_40c == 'I');
                auVar56[1] = -(cStack_40b == 'O');
                auVar56[2] = -(cStack_40a == 'N');
                auVar56[3] = -(cStack_409 == 'O');
                auVar56[4] = -(cStack_408 == 'S');
                auVar56[5] = -(cStack_407 == 'P');
                auVar56[6] = -(cStack_406 == 'H');
                auVar56[7] = -(cStack_405 == 'E');
                auVar56[8] = -(cStack_404 == 'R');
                auVar56[9] = -(cStack_403 == 'I');
                auVar56[10] = -(cStack_402 == 'C');
                auVar56[0xb] = -(cStack_401 == ' ');
                auVar56[0xc] = -(cStack_400 == 'C');
                auVar56[0xd] = -(cStack_3ff == 'O');
                auVar56[0xe] = -(cStack_3fe == 'R');
                auVar56[0xf] = -(cStack_3fd == 'R');
                if ((ushort)((ushort)(SUB161(auVar56 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar56[0xf] >> 7) << 0xf) == 0xffff) {
                  uStack_5f0 = 0x11d0de;
                  pcVar30 = coda_mem_record_new(*(coda_type_record **)
                                                 (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1c8),
                                                (coda_dynamic_type *)0x0);
                  local_5e8 = (char)_local_448;
                  cStack_5e7 = (char)((uint)_local_448 >> 8);
                  cStack_5e6 = (char)((uint)_local_448 >> 0x10);
                  cStack_5e5 = (char)((uint)_local_448 >> 0x18);
                  cStack_5e4 = '\0';
                  uStack_5f0 = 0x11d0f8;
                  sVar27 = strlen(&local_5e8);
                  if (0 < (long)sVar27) {
                    lVar21 = sVar27 + 1;
                    do {
                      if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
                      *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
                      lVar21 = lVar21 + -1;
                    } while (1 < lVar21);
                  }
                  bVar34 = false;
                  uStack_5f0 = 0x11d137;
                  pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                                 (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1b0),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,&local_5e8);
                  uStack_5f0 = 0x11d14b;
                  coda_mem_record_add_field(pcVar30,"type",(coda_dynamic_type *)pcVar23,0);
                  uStack_5f0 = 0x11d162;
                  pcVar26 = coda_mem_array_new(*(coda_type_array **)
                                                (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1c0),
                                               (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x11d17e;
                  lVar21 = coda_ascii_parse_double(acStack_443,0xc,(double *)&local_5a0,0);
                  if (-1 < lVar21) {
                    pcVar31 = (char *)((long)&local_438 + 1);
                    uVar33 = 0xffffffffffffffff;
                    do {
                      index = uVar33 + 1;
                      uStack_5f0 = 0x11d1bc;
                      pcVar23 = coda_mem_double_new(*(coda_type_number **)
                                                     (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1b8),
                                                    (coda_dynamic_type *)0x0,
                                                    (coda_product *)local_590._8_8_,
                                                    (double)CONCAT44(uStack_59c,local_5a0));
                      uStack_5f0 = 0x11d1ca;
                      coda_mem_array_set_element(pcVar26,index,(coda_dynamic_type *)pcVar23);
                      if (uVar33 == 2) {
                        bVar34 = true;
                        uStack_5f0 = 0x11d533;
                        coda_mem_record_add_field
                                  (pcVar30,"parameter",(coda_dynamic_type *)pcVar26,0);
                        uStack_5f0 = 0x11d543;
                        coda_mem_array_add_element
                                  ((coda_mem_array *)local_478._0_8_,(coda_dynamic_type *)pcVar30);
                        goto LAB_0011d550;
                      }
                      uStack_5f0 = 0x11d1e8;
                      lVar21 = coda_ascii_parse_double(pcVar31,0xc,(double *)&local_5a0,0);
                      pcVar31 = pcVar31 + 0xc;
                      uVar33 = index;
                    } while (-1 < lVar21);
                    bVar34 = 2 < index;
                  }
                  uStack_5f0 = 0x11d211;
                  coda_dynamic_type_delete((coda_dynamic_type *)pcVar26);
                  uStack_5f0 = 0x11d219;
                  coda_dynamic_type_delete((coda_dynamic_type *)pcVar30);
                  uStack_5f0 = 0x11d237;
                  coda_add_error_message
                            (" (line: %ld, byte offset: %ld)",local_4a8._0_8_,local_4a8._8_8_);
LAB_0011d550:
                  if (!bVar34) break;
                }
                else {
                  auVar57[0] = -(local_40c == 'T');
                  auVar57[1] = -(cStack_40b == 'I');
                  auVar57[2] = -(cStack_40a == 'M');
                  auVar57[3] = -(cStack_409 == 'E');
                  auVar57[4] = -(cStack_408 == ' ');
                  auVar57[5] = -(cStack_407 == 'S');
                  auVar57[6] = -(cStack_406 == 'Y');
                  auVar57[7] = -(cStack_405 == 'S');
                  auVar57[8] = -(cStack_404 == 'T');
                  auVar57[9] = -(cStack_403 == 'E');
                  auVar57[10] = -(cStack_402 == 'M');
                  auVar57[0xb] = -(cStack_401 == ' ');
                  auVar57[0xc] = -(cStack_400 == 'C');
                  auVar57[0xd] = -(cStack_3ff == 'O');
                  auVar57[0xe] = -(cStack_3fe == 'R');
                  auVar57[0xf] = -(cStack_3fd == 'R');
                  if ((ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar57[0xf] >> 7) << 0xf) != 0xffff) {
                    if (CONCAT13(cStack_401,CONCAT12(cStack_402,CONCAT11(cStack_403,cStack_404))) ==
                        0x53444e4f &&
                        CONCAT17(cStack_405,
                                 CONCAT16(cStack_406,
                                          CONCAT15(cStack_407,
                                                   CONCAT14(cStack_408,
                                                            CONCAT13(cStack_409,
                                                                     CONCAT12(cStack_40a,
                                                                              CONCAT11(cStack_40b,
                                                                                       local_40c))))
                                                  ))) == 0x434553205041454c) {
                      uStack_5f0 = 0x11cf06;
                      lVar22 = coda_ascii_parse_int64(local_448,6,(int64_t *)local_598,0);
                      lVar21 = local_4a8._8_8_;
                      if (-1 < lVar22) {
                        uStack_5f0 = 0x11cf2f;
                        pcVar23 = coda_mem_int32_new(*(coda_type_number **)
                                                      (*(long *)(in_FS_OFFSET + -0x1c8) + 0x148),
                                                     (coda_dynamic_type *)0x0,
                                                     (coda_product *)local_590._8_8_,local_598[0]);
                        pcVar31 = "leap_seconds";
                        goto LAB_0011d0b8;
                      }
                      goto LAB_0011dc9c;
                    }
                    if (CONCAT17(cStack_400,
                                 CONCAT16(cStack_401,
                                          CONCAT15(cStack_402,
                                                   CONCAT14(cStack_403,
                                                            CONCAT13(cStack_404,
                                                                     CONCAT12(cStack_405,
                                                                              CONCAT11(cStack_406,
                                                                                       cStack_407)))
                                                           )))) == 0x5245444145482046 &&
                        CONCAT17(cStack_405,
                                 CONCAT16(cStack_406,
                                          CONCAT15(cStack_407,
                                                   CONCAT14(cStack_408,
                                                            CONCAT13(cStack_409,
                                                                     CONCAT12(cStack_40a,
                                                                              CONCAT11(cStack_40b,
                                                                                       local_40c))))
                                                  ))) == 0x4820464f20444e45) goto LAB_0011dd07;
                    message = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
                    lVar21 = local_4a8._8_8_ + 0x3c;
                    goto LAB_0011b6e3;
                  }
                  uStack_5f0 = 0x11d253;
                  pcVar30 = coda_mem_record_new(*(coda_type_record **)
                                                 (*(long *)(in_FS_OFFSET + -0x1c8) + 0x210),
                                                (coda_dynamic_type *)0x0);
                  local_5e8 = (char)_local_448;
                  cStack_5e7 = (char)((uint)_local_448 >> 8);
                  cStack_5e6 = (char)((uint)_local_448 >> 0x10);
                  cStack_5e5 = (char)((uint)_local_448 >> 0x18);
                  cStack_5e4 = '\0';
                  uStack_5f0 = 0x11d26d;
                  sVar27 = strlen(&local_5e8);
                  if (0 < (long)sVar27) {
                    lVar21 = sVar27 + 1;
                    do {
                      if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
                      *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
                      lVar21 = lVar21 + -1;
                    } while (1 < lVar21);
                  }
                  uStack_5f0 = 0x11d2a9;
                  pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                                 (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1d8),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,&local_5e8);
                  uStack_5f0 = 0x11d2bd;
                  coda_mem_record_add_field(pcVar30,"type",(coda_dynamic_type *)pcVar23,0);
                  bVar34 = cStack_5e7 == 'B';
                  bVar3 = local_5e8 == 'S';
                  uStack_5f0 = 0x11d2eb;
                  lVar21 = coda_ascii_parse_double(acStack_443,0x11,(double *)&local_5a0,0);
                  if (lVar21 < 0) {
                    uStack_5f0 = 0x11debd;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar30);
                    lVar21 = local_4a8._8_8_ + 5;
                    goto LAB_0011dc9c;
                  }
                  uStack_5f0 = 0x11d316;
                  pcVar23 = coda_mem_double_new(*(coda_type_number **)
                                                 (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1e0),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,
                                                (double)CONCAT44(uStack_59c,local_5a0));
                  uStack_5f0 = 0x11d32a;
                  coda_mem_record_add_field(pcVar30,"a0",(coda_dynamic_type *)pcVar23,0);
                  uStack_5f0 = 0x11d341;
                  lVar21 = coda_ascii_parse_double
                                     ((char *)((long)&uStack_434 + 2),0x10,(double *)&local_5a0,0);
                  if (lVar21 < 0) {
                    uStack_5f0 = 0x11dede;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar30);
                    lVar21 = local_4a8._8_8_ + 0x16;
                    goto LAB_0011dc9c;
                  }
                  uStack_5f0 = 0x11d36c;
                  pcVar23 = coda_mem_double_new(*(coda_type_number **)
                                                 (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1e8),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,
                                                (double)CONCAT44(uStack_59c,local_5a0));
                  uStack_5f0 = 0x11d380;
                  coda_mem_record_add_field(pcVar30,"a1",(coda_dynamic_type *)pcVar23,0);
                  uStack_5f0 = 0x11d39c;
                  lVar21 = coda_ascii_parse_int64
                                     ((char *)((long)&uStack_424 + 2),7,(int64_t *)local_598,0);
                  if (lVar21 < 0) {
                    uStack_5f0 = 0x11deff;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar30);
                    lVar21 = local_4a8._8_8_ + 0x26;
                    goto LAB_0011dc9c;
                  }
                  uStack_5f0 = 0x11d3c5;
                  pcVar23 = coda_mem_int32_new(*(coda_type_number **)
                                                (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1f0),
                                               (coda_dynamic_type *)0x0,
                                               (coda_product *)local_590._8_8_,local_598[0]);
                  uStack_5f0 = 0x11d3d9;
                  coda_mem_record_add_field(pcVar30,"T",(coda_dynamic_type *)pcVar23,0);
                  uStack_5f0 = 0x11d3f0;
                  lVar21 = coda_ascii_parse_int64
                                     ((char *)((long)&uStack_41c + 1),5,(int64_t *)local_598,0);
                  if (lVar21 < 0) {
                    uStack_5f0 = 0x11df20;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar30);
                    lVar21 = local_4a8._8_8_ + 0x2d;
                    goto LAB_0011dc9c;
                  }
                  uStack_5f0 = 0x11d41a;
                  pcVar23 = coda_mem_int16_new(*(coda_type_number **)
                                                (*(long *)(in_FS_OFFSET + -0x1c8) + 0x1f8),
                                               (coda_dynamic_type *)0x0,
                                               (coda_product *)local_590._8_8_,
                                               (uint16_t)local_598[0]);
                  uStack_5f0 = 0x11d42e;
                  coda_mem_record_add_field(pcVar30,"W",(coda_dynamic_type *)pcVar23,0);
                  if (bVar34 && bVar3) {
                    cStack_5e4 = cStack_411;
                    local_5e8 = (char)uStack_415;
                    cStack_5e7 = (char)((uint)uStack_415 >> 8);
                    cStack_5e6 = (char)((uint)uStack_415 >> 0x10);
                    cStack_5e5 = (char)((uint)uStack_415 >> 0x18);
                    cStack_5e3 = '\0';
                    uStack_5f0 = 0x11d453;
                    sVar27 = strlen(&local_5e8);
                    if (0 < (long)sVar27) {
                      lVar21 = sVar27 + 1;
                      do {
                        if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
                        *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
                        lVar21 = lVar21 + -1;
                      } while (1 < lVar21);
                    }
                    uStack_5f0 = 0x11d48f;
                    pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                                   (*(long *)(in_FS_OFFSET + -0x1c8) + 0x200),
                                                  (coda_dynamic_type *)0x0,
                                                  (coda_product *)local_590._8_8_,&local_5e8);
                    uStack_5f0 = 0x11d4a3;
                    coda_mem_record_add_field(pcVar30,"S",(coda_dynamic_type *)pcVar23,0);
                    uStack_5f0 = 0x11d4ba;
                    lVar21 = coda_ascii_parse_int64
                                       ((char *)((long)&local_410 + 1),2,(int64_t *)local_598,0);
                    if (lVar21 < 0) {
                      uStack_5f0 = 0x11df41;
                      coda_dynamic_type_delete((coda_dynamic_type *)pcVar30);
                      lVar21 = local_4a8._8_8_ + 0x39;
                      goto LAB_0011dc9c;
                    }
                    uStack_5f0 = 0x11d4e4;
                    pcVar23 = coda_mem_uint8_new(*(coda_type_number **)
                                                  (*(long *)(in_FS_OFFSET + -0x1c8) + 0x208),
                                                 (coda_dynamic_type *)0x0,
                                                 (coda_product *)local_590._8_8_,
                                                 (uint8_t)local_598[0]);
                    uStack_5f0 = 0x11d4f8;
                    coda_mem_record_add_field(pcVar30,"U",(coda_dynamic_type *)pcVar23,0);
                  }
                  uStack_5f0 = 0x11d508;
                  coda_mem_array_add_element
                            ((coda_mem_array *)local_478._8_8_,(coda_dynamic_type *)pcVar30);
                }
              }
              uStack_5f0 = 0x11d573;
              local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
              local_4a8._0_8_ = local_4a8._0_8_ + 1;
              uStack_5f0 = 0x11d595;
              uVar20 = get_line((FILE *)local_590._0_8_,local_448);
            } while (-1 < (int)uVar20);
          }
          goto LAB_0011b6ea;
        }
        if (local_4b0 != 'O') {
          uStack_5f0 = 0x11d5b9;
          pcVar26 = coda_mem_array_new(*(coda_type_array **)
                                        (*(long *)(in_FS_OFFSET + -0x1c8) + 0x100),
                                       (coda_dynamic_type *)0x0);
          local_488 = (undefined1  [8])pcVar26;
          uStack_5f0 = 0x11d5cb;
          local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
          local_4a8._0_8_ = local_4a8._0_8_ + 1;
          uStack_5f0 = 0x11d5ed;
          uVar20 = get_line((FILE *)local_590._0_8_,local_448);
          if (-1 < (int)uVar20) {
            local_458 = 0x5552202f204d4750;
            uStack_450 = 0x44202f205942204e;
            local_468 = 0x42204e5552202f20;
            uStack_460 = 0x45544144202f2059;
            local_48 = 0x2023202f20535953;
            uStack_40 = 0x59542053424f202f;
            local_58 = 0x4f202f2023202f20;
            uStack_50 = 0x5345505954205342;
            do {
              if (uVar20 == 0) {
LAB_0011e005:
                uStack_5f0 = 0x11e020;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"sys",(coda_dynamic_type *)local_488,
                           0);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = pcStack_480;
                _local_488 = auVar5 << 0x40;
                uStack_5f0 = 0x11e036;
                local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
                local_4a8._0_8_ = local_4a8._0_8_ + 1;
                uStack_5f0 = 0x11e050;
                iVar19 = coda_mem_record_validate((coda_mem_record *)local_590._16_8_);
                if (iVar19 == 0) {
                  uStack_5f0 = 0x11e062;
                  pcVar29 = coda_type_array_new(coda_format_rinex);
                  uStack_5f0 = 0x11e06f;
                  coda_type_array_add_variable_dimension(pcVar29,(coda_expression *)0x0);
                  uStack_5f0 = 0x11e087;
                  coda_type_array_set_base_type
                            (pcVar29,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x478));
                  uStack_5f0 = 0x11e091;
                  pcVar26 = coda_mem_array_new(pcVar29,(coda_dynamic_type *)0x0);
                  pcStack_480 = pcVar26;
                  uStack_5f0 = 0x11e0a5;
                  coda_type_release((coda_type *)pcVar29);
                  uStack_5f0 = 0x11e0ad;
                  iVar19 = read_clock_records((ingest_info *)local_590);
                  goto LAB_0011e17e;
                }
                break;
              }
              if (uVar20 < 0x3d) goto LAB_0011dcaf;
              auVar58[0] = -(local_40c == (char)local_458);
              auVar58[1] = -(cStack_40b == local_458._1_1_);
              auVar58[2] = -(cStack_40a == local_458._2_1_);
              auVar58[3] = -(cStack_409 == local_458._3_1_);
              auVar58[4] = -(cStack_408 == local_458._4_1_);
              auVar58[5] = -(cStack_407 == local_458._5_1_);
              auVar58[6] = -(cStack_406 == local_458._6_1_);
              auVar58[7] = -(cStack_405 == local_458._7_1_);
              auVar58[8] = -(cStack_404 == (char)uStack_450);
              auVar58[9] = -(cStack_403 == uStack_450._1_1_);
              auVar58[10] = -(cStack_402 == uStack_450._2_1_);
              auVar58[0xb] = -(cStack_401 == uStack_450._3_1_);
              auVar58[0xc] = -(cStack_400 == uStack_450._4_1_);
              auVar58[0xd] = -(cStack_3ff == uStack_450._5_1_);
              auVar58[0xe] = -(cStack_3fe == uStack_450._6_1_);
              auVar58[0xf] = -(cStack_3fd == uStack_450._7_1_);
              auVar87[0] = -(cStack_409 == (char)local_468);
              auVar87[1] = -(cStack_408 == local_468._1_1_);
              auVar87[2] = -(cStack_407 == local_468._2_1_);
              auVar87[3] = -(cStack_406 == local_468._3_1_);
              auVar87[4] = -(cStack_405 == local_468._4_1_);
              auVar87[5] = -(cStack_404 == local_468._5_1_);
              auVar87[6] = -(cStack_403 == local_468._6_1_);
              auVar87[7] = -(cStack_402 == local_468._7_1_);
              auVar87[8] = -(cStack_401 == (char)uStack_460);
              auVar87[9] = -(cStack_400 == uStack_460._1_1_);
              auVar87[10] = -(cStack_3ff == uStack_460._2_1_);
              auVar87[0xb] = -(cStack_3fe == uStack_460._3_1_);
              auVar87[0xc] = -(cStack_3fd == uStack_460._4_1_);
              auVar87[0xd] = -(local_3fc == uStack_460._5_1_);
              auVar87[0xe] = -(cStack_3fb == uStack_460._6_1_);
              auVar87[0xf] = -(cStack_3fa == uStack_460._7_1_);
              auVar87 = auVar87 & auVar58;
              if ((ushort)((ushort)(SUB161(auVar87 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar87 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar87 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar87 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar87 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar87 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar87 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar87 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar87 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar87[0xf] >> 7) << 0xf) == 0xffff) {
                local_5e8 = (char)_local_448;
                cStack_5e7 = (char)((uint)_local_448 >> 8);
                cStack_5e6 = (char)((uint)_local_448 >> 0x10);
                uStack_5e2 = (undefined1)acStack_443._1_2_;
                uStack_5e1 = SUB21(acStack_443._1_2_,1);
                uStack_5e0 = (undefined7)stack0xfffffffffffffbc0;
                cStack_5d9 = (char)((ulong)stack0xfffffffffffffbc0 >> 0x38);
                local_5d8 = (uint5)local_438;
                uStack_5f0 = 0x11da2c;
                cStack_5e5 = cStack_445;
                sVar27 = strlen(&local_5e8);
                if (0 < (long)sVar27) {
                  lVar21 = sVar27 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
                    lVar21 = lVar21 + -1;
                  } while (1 < lVar21);
                }
                uStack_5f0 = 0x11da65;
                pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x1c8) + 0x18),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x11da7b;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"program",
                           (coda_dynamic_type *)pcVar23,0);
                local_5e8 = (char)uStack_434;
                cStack_5e7 = (char)(uStack_434 >> 8);
                cStack_5e6 = (char)(uStack_434 >> 0x10);
                cStack_5e5 = (char)(uStack_434 >> 0x18);
                cStack_5e4 = (char)uStack_430;
                cStack_5e3 = (char)((uint)uStack_430 >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_430 >> 0x10);
                uStack_5e1 = (undefined1)((uint)uStack_430 >> 0x18);
                uStack_5e0 = (undefined7)CONCAT44(uStack_428,uStack_42c);
                cStack_5d9 = (char)((uint)uStack_428 >> 0x18);
                _local_5d8 = CONCAT44(stack0xfffffffffffffa2c,uStack_424);
                uStack_5f0 = 0x11da96;
                sVar27 = strlen(&local_5e8);
                if (0 < (long)sVar27) {
                  lVar21 = sVar27 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
                    lVar21 = lVar21 + -1;
                  } while (1 < lVar21);
                }
                uStack_5f0 = 0x11dacf;
                pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x1c8) + 0x20),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x11dae5;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"run_by",(coda_dynamic_type *)pcVar23
                           ,0);
                local_5e8 = (char)uStack_420;
                cStack_5e7 = (char)((uint)uStack_420 >> 8);
                cStack_5e6 = (char)((uint)uStack_420 >> 0x10);
                cStack_5e5 = (char)((uint)uStack_420 >> 0x18);
                cStack_5e4 = (char)uStack_41c;
                cStack_5e3 = (char)((uint)uStack_41c >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_41c >> 0x10);
                uStack_5e1 = uStack_41c._3_1_;
                uStack_5e0 = (undefined7)
                             (CONCAT44(uStack_415,
                                       CONCAT13(cStack_416,CONCAT21(uStack_418,uStack_41c._3_1_)))
                             >> 8);
                cStack_5d9 = '\0';
                uStack_5f0 = 0x11db17;
                pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x1c8) + 0x30),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x11db2e;
                pcVar28 = coda_mem_time_new(*(coda_type_special **)
                                             (*(long *)(in_FS_OFFSET + -0x1c8) + 0x28),
                                            (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar23);
                uStack_5f0 = 0x11db44;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"datetime",
                           (coda_dynamic_type *)pcVar28,0);
                local_5e8 = (char)local_410;
                cStack_5e7 = (char)((ushort)local_410 >> 8);
                cStack_5e6 = cStack_40e;
                cStack_5e5 = 0;
                uStack_5f0 = 0x11db76;
                pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x1c8) + 0x38),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                pcVar31 = "datetime_time_zone";
                goto LAB_0011db82;
              }
              if (CONCAT13(cStack_406,CONCAT12(cStack_407,CONCAT11(cStack_408,cStack_409))) !=
                  0x544e454d ||
                  CONCAT13(cStack_409,CONCAT12(cStack_40a,CONCAT11(cStack_40b,local_40c))) !=
                  0x4d4d4f43) {
                auVar59[0] = -(local_40c == (char)local_48);
                auVar59[1] = -(cStack_40b == local_48._1_1_);
                auVar59[2] = -(cStack_40a == local_48._2_1_);
                auVar59[3] = -(cStack_409 == local_48._3_1_);
                auVar59[4] = -(cStack_408 == local_48._4_1_);
                auVar59[5] = -(cStack_407 == local_48._5_1_);
                auVar59[6] = -(cStack_406 == local_48._6_1_);
                auVar59[7] = -(cStack_405 == local_48._7_1_);
                auVar59[8] = -(cStack_404 == (char)uStack_40);
                auVar59[9] = -(cStack_403 == uStack_40._1_1_);
                auVar59[10] = -(cStack_402 == uStack_40._2_1_);
                auVar59[0xb] = -(cStack_401 == uStack_40._3_1_);
                auVar59[0xc] = -(cStack_400 == uStack_40._4_1_);
                auVar59[0xd] = -(cStack_3ff == uStack_40._5_1_);
                auVar59[0xe] = -(cStack_3fe == uStack_40._6_1_);
                auVar59[0xf] = -(cStack_3fd == uStack_40._7_1_);
                auVar88[0] = -(cStack_409 == (char)local_58);
                auVar88[1] = -(cStack_408 == local_58._1_1_);
                auVar88[2] = -(cStack_407 == local_58._2_1_);
                auVar88[3] = -(cStack_406 == local_58._3_1_);
                auVar88[4] = -(cStack_405 == local_58._4_1_);
                auVar88[5] = -(cStack_404 == local_58._5_1_);
                auVar88[6] = -(cStack_403 == local_58._6_1_);
                auVar88[7] = -(cStack_402 == local_58._7_1_);
                auVar88[8] = -(cStack_401 == (char)uStack_50);
                auVar88[9] = -(cStack_400 == uStack_50._1_1_);
                auVar88[10] = -(cStack_3ff == uStack_50._2_1_);
                auVar88[0xb] = -(cStack_3fe == uStack_50._3_1_);
                auVar88[0xc] = -(cStack_3fd == uStack_50._4_1_);
                auVar88[0xd] = -(local_3fc == uStack_50._5_1_);
                auVar88[0xe] = -(cStack_3fb == uStack_50._6_1_);
                auVar88[0xf] = -(cStack_3fa == uStack_50._7_1_);
                auVar88 = auVar88 & auVar59;
                if ((ushort)((ushort)(SUB161(auVar88 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar88[0xf] >> 7) << 0xf) == 0xffff) {
                  uStack_5f0 = 0x11db9b;
                  iVar19 = handle_observation_definition((ingest_info *)local_590,local_448);
                  if (iVar19 != 0) break;
                }
                else {
                  if (CONCAT17(cStack_3ff,
                               CONCAT16(cStack_400,
                                        CONCAT15(cStack_401,
                                                 CONCAT14(cStack_402,
                                                          CONCAT13(cStack_403,
                                                                   CONCAT12(cStack_404,
                                                                            CONCAT11(cStack_405,
                                                                                     cStack_406)))))
                                       )) == 0x4449204d45545359 &&
                      CONCAT17(cStack_405,
                               CONCAT16(cStack_406,
                                        CONCAT15(cStack_407,
                                                 CONCAT14(cStack_408,
                                                          CONCAT13(cStack_409,
                                                                   CONCAT12(cStack_40a,
                                                                            CONCAT11(cStack_40b,
                                                                                     local_40c))))))
                              ) == 0x53595320454d4954) {
                    cStack_5e6 = acStack_443[0];
                    local_5e8 = cStack_445;
                    cStack_5e7 = cStack_444;
                    cStack_5e5 = 0;
                    uStack_5f0 = 0x11dbf5;
                    sVar27 = strlen(&local_5e8);
                    if (0 < (long)sVar27) {
                      lVar21 = sVar27 + 1;
                      do {
                        if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
                        *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
                        lVar21 = lVar21 + -1;
                      } while (1 < lVar21);
                    }
                    uStack_5f0 = 0x11dc31;
                    pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                                   (*(long *)(in_FS_OFFSET + -0x1c8) + 0x158),
                                                  (coda_dynamic_type *)0x0,
                                                  (coda_product *)local_590._8_8_,&local_5e8);
                    pcVar31 = "time_system_id";
                  }
                  else {
                    if (CONCAT13(cStack_401,CONCAT12(cStack_402,CONCAT11(cStack_403,cStack_404))) !=
                        0x53444e4f ||
                        CONCAT17(cStack_405,
                                 CONCAT16(cStack_406,
                                          CONCAT15(cStack_407,
                                                   CONCAT14(cStack_408,
                                                            CONCAT13(cStack_409,
                                                                     CONCAT12(cStack_40a,
                                                                              CONCAT11(cStack_40b,
                                                                                       local_40c))))
                                                  ))) != 0x434553205041454c) {
                      auVar60[0] = -(local_40c == 'S');
                      auVar60[1] = -(cStack_40b == 'Y');
                      auVar60[2] = -(cStack_40a == 'S');
                      auVar60[3] = -(cStack_409 == ' ');
                      auVar60[4] = -(cStack_408 == '/');
                      auVar60[5] = -(cStack_407 == ' ');
                      auVar60[6] = -(cStack_406 == 'D');
                      auVar60[7] = -(cStack_405 == 'C');
                      auVar60[8] = -(cStack_404 == 'B');
                      auVar60[9] = -(cStack_403 == 'S');
                      auVar60[10] = -(cStack_402 == ' ');
                      auVar60[0xb] = -(cStack_401 == 'A');
                      auVar60[0xc] = -(cStack_400 == 'P');
                      auVar60[0xd] = -(cStack_3ff == 'P');
                      auVar60[0xe] = -(cStack_3fe == 'L');
                      auVar60[0xf] = -(cStack_3fd == 'I');
                      auVar89[0] = -(local_3fc == 'E');
                      auVar89[1] = -(cStack_3fb == 'D');
                      auVar89[2] = 0xff;
                      auVar89[3] = 0xff;
                      auVar89[4] = 0xff;
                      auVar89[5] = 0xff;
                      auVar89[6] = 0xff;
                      auVar89[7] = 0xff;
                      auVar89[8] = 0xff;
                      auVar89[9] = 0xff;
                      auVar89[10] = 0xff;
                      auVar89[0xb] = 0xff;
                      auVar89[0xc] = 0xff;
                      auVar89[0xd] = 0xff;
                      auVar89[0xe] = 0xff;
                      auVar89[0xf] = 0xff;
                      auVar89 = auVar89 & auVar60;
                      if ((((((ushort)((ushort)(SUB161(auVar89 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar89[0xf] >> 7) << 0xf) == 0xffff) ||
                            (auVar61[0] = -(local_40c == 'S'), auVar61[1] = -(cStack_40b == 'Y'),
                            auVar61[2] = -(cStack_40a == 'S'), auVar61[3] = -(cStack_409 == ' '),
                            auVar61[4] = -(cStack_408 == '/'), auVar61[5] = -(cStack_407 == ' '),
                            auVar61[6] = -(cStack_406 == 'P'), auVar61[7] = -(cStack_405 == 'C'),
                            auVar61[8] = -(cStack_404 == 'V'), auVar61[9] = -(cStack_403 == 'S'),
                            auVar61[10] = -(cStack_402 == ' '), auVar61[0xb] = -(cStack_401 == 'A'),
                            auVar61[0xc] = -(cStack_400 == 'P'), auVar61[0xd] = -(cStack_3ff == 'P')
                            , auVar61[0xe] = -(cStack_3fe == 'L'),
                            auVar61[0xf] = -(cStack_3fd == 'I'), auVar90[0] = -(local_3fc == 'E'),
                            auVar90[1] = -(cStack_3fb == 'D'), auVar90[2] = 0xff, auVar90[3] = 0xff,
                            auVar90[4] = 0xff, auVar90[5] = 0xff, auVar90[6] = 0xff,
                            auVar90[7] = 0xff, auVar90[8] = 0xff, auVar90[9] = 0xff,
                            auVar90[10] = 0xff, auVar90[0xb] = 0xff, auVar90[0xc] = 0xff,
                            auVar90[0xd] = 0xff, auVar90[0xe] = 0xff, auVar90[0xf] = 0xff,
                            auVar90 = auVar90 & auVar61,
                            (ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar90 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar90[0xf] >> 7) << 0xf) == 0xffff)) ||
                           (auVar62[0] = -(local_40c == '#'), auVar62[1] = -(cStack_40b == ' '),
                           auVar62[2] = -(cStack_40a == '/'), auVar62[3] = -(cStack_409 == ' '),
                           auVar62[4] = -(cStack_408 == 'T'), auVar62[5] = -(cStack_407 == 'Y'),
                           auVar62[6] = -(cStack_406 == 'P'), auVar62[7] = -(cStack_405 == 'E'),
                           auVar62[8] = -(cStack_404 == 'S'), auVar62[9] = -(cStack_403 == ' '),
                           auVar62[10] = -(cStack_402 == 'O'), auVar62[0xb] = -(cStack_401 == 'F'),
                           auVar62[0xc] = -(cStack_400 == ' '), auVar62[0xd] = -(cStack_3ff == 'D'),
                           auVar62[0xe] = -(cStack_3fe == 'A'), auVar62[0xf] = -(cStack_3fd == 'T'),
                           auVar91[0] = -(local_3fc == 'A'), auVar91[1] = 0xff, auVar91[2] = 0xff,
                           auVar91[3] = 0xff, auVar91[4] = 0xff, auVar91[5] = 0xff,
                           auVar91[6] = 0xff, auVar91[7] = 0xff, auVar91[8] = 0xff,
                           auVar91[9] = 0xff, auVar91[10] = 0xff, auVar91[0xb] = 0xff,
                           auVar91[0xc] = 0xff, auVar91[0xd] = 0xff, auVar91[0xe] = 0xff,
                           auVar91[0xf] = 0xff, auVar91 = auVar91 & auVar62,
                           (ushort)((ushort)(SUB161(auVar91 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar91 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar91 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar91 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar91 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar91 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar91 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar91 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar91 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar91[0xf] >> 7) << 0xf) == 0xffff)) ||
                          (((auVar63[0] = -(local_40c == 'S'), auVar63[1] = -(cStack_40b == 'T'),
                            auVar63[2] = -(cStack_40a == 'A'), auVar63[3] = -(cStack_409 == 'T'),
                            auVar63[4] = -(cStack_408 == 'I'), auVar63[5] = -(cStack_407 == 'O'),
                            auVar63[6] = -(cStack_406 == 'N'), auVar63[7] = -(cStack_405 == ' '),
                            auVar63[8] = -(cStack_404 == 'N'), auVar63[9] = -(cStack_403 == 'A'),
                            auVar63[10] = -(cStack_402 == 'M'), auVar63[0xb] = -(cStack_401 == 'E'),
                            auVar63[0xc] = -(cStack_400 == ' '), auVar63[0xd] = -(cStack_3ff == '/')
                            , auVar63[0xe] = -(cStack_3fe == ' '),
                            auVar63[0xf] = -(cStack_3fd == 'N'), auVar92[0] = -(local_3fc == 'U'),
                            auVar92[1] = -(cStack_3fb == 'M'), auVar92[2] = 0xff, auVar92[3] = 0xff,
                            auVar92[4] = 0xff, auVar92[5] = 0xff, auVar92[6] = 0xff,
                            auVar92[7] = 0xff, auVar92[8] = 0xff, auVar92[9] = 0xff,
                            auVar92[10] = 0xff, auVar92[0xb] = 0xff, auVar92[0xc] = 0xff,
                            auVar92[0xd] = 0xff, auVar92[0xe] = 0xff, auVar92[0xf] = 0xff,
                            auVar92 = auVar92 & auVar63,
                            (ushort)((ushort)(SUB161(auVar92 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar92 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar92 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar92 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar92 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar92 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar92 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar92 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar92 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar92 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar92 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar92 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar92 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar92 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar92 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar92[0xf] >> 7) << 0xf) == 0xffff ||
                            (CONCAT17(cStack_3fe,
                                      CONCAT16(cStack_3ff,
                                               CONCAT15(cStack_400,
                                                        CONCAT14(cStack_401,
                                                                 CONCAT13(cStack_402,
                                                                          CONCAT12(cStack_403,
                                                                                   CONCAT11(
                                                  cStack_404,cStack_405))))))) == 0x464552204b4c4320
                             && CONCAT17(cStack_405,
                                         CONCAT16(cStack_406,
                                                  CONCAT15(cStack_407,
                                                           CONCAT14(cStack_408,
                                                                    CONCAT13(cStack_409,
                                                                             CONCAT12(cStack_40a,
                                                                                      CONCAT11(
                                                  cStack_40b,local_40c))))))) == 0x204e4f4954415453)
                            ) || ((CONCAT17(cStack_3fe,
                                            CONCAT16(cStack_3ff,
                                                     CONCAT15(cStack_400,
                                                              CONCAT14(cStack_401,
                                                                       CONCAT13(cStack_402,
                                                                                CONCAT12(cStack_403,
                                                                                         CONCAT11(
                                                  cStack_404,cStack_405))))))) == 0x5245544e45432053
                                   && CONCAT17(cStack_405,
                                               CONCAT16(cStack_406,
                                                        CONCAT15(cStack_407,
                                                                 CONCAT14(cStack_408,
                                                                          CONCAT13(cStack_409,
                                                                                   CONCAT12(
                                                  cStack_40a,CONCAT11(cStack_40b,local_40c))))))) ==
                                      0x534953594c414e41 ||
                                  ((CONCAT13(cStack_401,
                                             CONCAT12(cStack_402,CONCAT11(cStack_403,cStack_404)))
                                    == 0x46455220 &&
                                    CONCAT17(cStack_405,
                                             CONCAT16(cStack_406,
                                                      CONCAT15(cStack_407,
                                                               CONCAT14(cStack_408,
                                                                        CONCAT13(cStack_409,
                                                                                 CONCAT12(cStack_40a
                                                                                          ,CONCAT11(
                                                  cStack_40b,local_40c))))))) == 0x4b4c4320464f2023
                                   || (auVar64[0] = -(local_40c == 'A'),
                                      auVar64[1] = -(cStack_40b == 'N'),
                                      auVar64[2] = -(cStack_40a == 'A'),
                                      auVar64[3] = -(cStack_409 == 'L'),
                                      auVar64[4] = -(cStack_408 == 'Y'),
                                      auVar64[5] = -(cStack_407 == 'S'),
                                      auVar64[6] = -(cStack_406 == 'I'),
                                      auVar64[7] = -(cStack_405 == 'S'),
                                      auVar64[8] = -(cStack_404 == ' '),
                                      auVar64[9] = -(cStack_403 == 'C'),
                                      auVar64[10] = -(cStack_402 == 'L'),
                                      auVar64[0xb] = -(cStack_401 == 'K'),
                                      auVar64[0xc] = -(cStack_400 == ' '),
                                      auVar64[0xd] = -(cStack_3ff == 'R'),
                                      auVar64[0xe] = -(cStack_3fe == 'E'),
                                      auVar64[0xf] = -(cStack_3fd == 'F'),
                                      (ushort)((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe |
                                              (ushort)(auVar64[0xf] >> 7) << 0xf) == 0xffff))))))))
                         || ((auVar65[0] = -(local_40c == '#'), auVar65[1] = -(cStack_40b == ' '),
                             auVar65[2] = -(cStack_40a == 'O'), auVar65[3] = -(cStack_409 == 'F'),
                             auVar65[4] = -(cStack_408 == ' '), auVar65[5] = -(cStack_407 == 'S'),
                             auVar65[6] = -(cStack_406 == 'O'), auVar65[7] = -(cStack_405 == 'L'),
                             auVar65[8] = -(cStack_404 == 'N'), auVar65[9] = -(cStack_403 == ' '),
                             auVar65[10] = -(cStack_402 == 'S'), auVar65[0xb] = -(cStack_401 == 'T')
                             , auVar65[0xc] = -(cStack_400 == 'A'),
                             auVar65[0xd] = -(cStack_3ff == ' '),
                             auVar65[0xe] = -(cStack_3fe == '/'),
                             auVar65[0xf] = -(cStack_3fd == ' '), auVar93[0] = -(cStack_409 == 'F'),
                             auVar93[1] = -(cStack_408 == ' '), auVar93[2] = -(cStack_407 == 'S'),
                             auVar93[3] = -(cStack_406 == 'O'), auVar93[4] = -(cStack_405 == 'L'),
                             auVar93[5] = -(cStack_404 == 'N'), auVar93[6] = -(cStack_403 == ' '),
                             auVar93[7] = -(cStack_402 == 'S'), auVar93[8] = -(cStack_401 == 'T'),
                             auVar93[9] = -(cStack_400 == 'A'), auVar93[10] = -(cStack_3ff == ' '),
                             auVar93[0xb] = -(cStack_3fe == '/'),
                             auVar93[0xc] = -(cStack_3fd == ' '), auVar93[0xd] = -(local_3fc == 'T')
                             , auVar93[0xe] = -(cStack_3fb == 'R'),
                             auVar93[0xf] = -(cStack_3fa == 'F'), auVar93 = auVar93 & auVar65,
                             (ushort)((ushort)(SUB161(auVar93 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar93 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar93 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar93 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar93 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar93 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar93 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar93 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar93 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar93[0xf] >> 7) << 0xf) == 0xffff ||
                             (((auVar66[0] = -(local_40c == 'S'), auVar66[1] = -(cStack_40b == 'O'),
                               auVar66[2] = -(cStack_40a == 'L'), auVar66[3] = -(cStack_409 == 'N'),
                               auVar66[4] = -(cStack_408 == ' '), auVar66[5] = -(cStack_407 == 'S'),
                               auVar66[6] = -(cStack_406 == 'T'), auVar66[7] = -(cStack_405 == 'A'),
                               auVar66[8] = -(cStack_404 == ' '), auVar66[9] = -(cStack_403 == 'N'),
                               auVar66[10] = -(cStack_402 == 'A'),
                               auVar66[0xb] = -(cStack_401 == 'M'),
                               auVar66[0xc] = -(cStack_400 == 'E'),
                               auVar66[0xd] = -(cStack_3ff == ' '),
                               auVar66[0xe] = -(cStack_3fe == '/'),
                               auVar66[0xf] = -(cStack_3fd == ' '),
                               auVar94[0] = -(cStack_409 == 'N'), auVar94[1] = -(cStack_408 == ' '),
                               auVar94[2] = -(cStack_407 == 'S'), auVar94[3] = -(cStack_406 == 'T'),
                               auVar94[4] = -(cStack_405 == 'A'), auVar94[5] = -(cStack_404 == ' '),
                               auVar94[6] = -(cStack_403 == 'N'), auVar94[7] = -(cStack_402 == 'A'),
                               auVar94[8] = -(cStack_401 == 'M'), auVar94[9] = -(cStack_400 == 'E'),
                               auVar94[10] = -(cStack_3ff == ' '),
                               auVar94[0xb] = -(cStack_3fe == '/'),
                               auVar94[0xc] = -(cStack_3fd == ' '),
                               auVar94[0xd] = -(local_3fc == 'N'),
                               auVar94[0xe] = -(cStack_3fb == 'U'),
                               auVar94[0xf] = -(cStack_3fa == 'M'), auVar94 = auVar94 & auVar66,
                               (ushort)((ushort)(SUB161(auVar94 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar94 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar94 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar94 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar94 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar94 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar94 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar94 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar94 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar94 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar94 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar94 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar94 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar94 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar94 >> 0x77,0) & 1) << 0xe |
                                       (ushort)(byte)(auVar94[0xf] >> 7) << 0xf) == 0xffff ||
                               (CONCAT17(cStack_3ff,
                                         CONCAT16(cStack_400,
                                                  CONCAT15(cStack_401,
                                                           CONCAT14(cStack_402,
                                                                    CONCAT13(cStack_403,
                                                                             CONCAT12(cStack_404,
                                                                                      CONCAT11(
                                                  cStack_405,cStack_406))))))) == 0x53544153204e4c4f
                                && CONCAT17(cStack_405,
                                            CONCAT16(cStack_406,
                                                     CONCAT15(cStack_407,
                                                              CONCAT14(cStack_408,
                                                                       CONCAT13(cStack_409,
                                                                                CONCAT12(cStack_40a,
                                                                                         CONCAT11(
                                                  cStack_40b,local_40c))))))) == 0x4c4f5320464f2023)
                               ) || (CONCAT17(cStack_405,
                                              CONCAT16(cStack_406,
                                                       CONCAT15(cStack_407,
                                                                CONCAT14(cStack_408,
                                                                         CONCAT13(cStack_409,
                                                                                  CONCAT12(
                                                  cStack_40a,CONCAT11(cStack_40b,local_40c))))))) ==
                                     0x5453494c204e5250)))))) goto LAB_0011dba3;
                      if (CONCAT17(cStack_400,
                                   CONCAT16(cStack_401,
                                            CONCAT15(cStack_402,
                                                     CONCAT14(cStack_403,
                                                              CONCAT13(cStack_404,
                                                                       CONCAT12(cStack_405,
                                                                                CONCAT11(cStack_406,
                                                                                         cStack_407)
                                                                               )))))) ==
                          0x5245444145482046 &&
                          CONCAT17(cStack_405,
                                   CONCAT16(cStack_406,
                                            CONCAT15(cStack_407,
                                                     CONCAT14(cStack_408,
                                                              CONCAT13(cStack_409,
                                                                       CONCAT12(cStack_40a,
                                                                                CONCAT11(cStack_40b,
                                                                                         local_40c))
                                                                      ))))) == 0x4820464f20444e45)
                      goto LAB_0011e005;
                      goto LAB_0011dfdd;
                    }
                    uStack_5f0 = 0x11dc56;
                    lVar22 = coda_ascii_parse_int64(local_448,6,(int64_t *)&local_5a0,0);
                    lVar21 = local_4a8._8_8_;
                    if (lVar22 < 0) goto LAB_0011dc9c;
                    uStack_5f0 = 0x11dc7b;
                    pcVar23 = coda_mem_int32_new(*(coda_type_number **)
                                                  (*(long *)(in_FS_OFFSET + -0x1c8) + 0x148),
                                                 (coda_dynamic_type *)0x0,
                                                 (coda_product *)local_590._8_8_,local_5a0);
                    pcVar31 = "leap_seconds";
                  }
LAB_0011db82:
                  uStack_5f0 = 0x11db8c;
                  coda_mem_record_add_field
                            ((coda_mem_record *)local_590._16_8_,pcVar31,
                             (coda_dynamic_type *)pcVar23,0);
                }
              }
LAB_0011dba3:
              uStack_5f0 = 0x11dbad;
              local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
              local_4a8._0_8_ = local_4a8._0_8_ + 1;
              uStack_5f0 = 0x11dbca;
              uVar20 = get_line((FILE *)local_590._0_8_,local_448);
            } while (-1 < (int)uVar20);
          }
          goto LAB_0011b6ea;
        }
        uStack_5f0 = 0x11b8fa;
        pcVar24 = coda_type_record_new(coda_format_rinex);
        local_498._0_8_ = pcVar24;
        uStack_5f0 = 0x11b90e;
        pcVar25 = coda_type_record_field_new("epoch");
        uStack_5f0 = 0x11b929;
        coda_type_record_field_set_type
                  (pcVar25,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x168));
        uStack_5f0 = 0x11b939;
        coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar25);
        uStack_5f0 = 0x11b945;
        pcVar25 = coda_type_record_field_new("flag");
        uStack_5f0 = 0x11b960;
        coda_type_record_field_set_type
                  (pcVar25,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x170));
        uStack_5f0 = 0x11b970;
        coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar25);
        uStack_5f0 = 0x11b97c;
        pcVar25 = coda_type_record_field_new("receiver_clock_offset");
        uStack_5f0 = 0x11b997;
        coda_type_record_field_set_type
                  (pcVar25,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x178));
        uStack_5f0 = 0x11b9a7;
        coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar25);
        uStack_5f0 = 0x11b9be;
        pcVar26 = coda_mem_array_new(*(coda_type_array **)(*(long *)(in_FS_OFFSET + -0x1c8) + 0x100)
                                     ,(coda_dynamic_type *)0x0);
        local_488 = (undefined1  [8])pcVar26;
        uStack_5f0 = 0x11b9d0;
        local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
        local_4a8._0_8_ = local_4a8._0_8_ + 1;
        uStack_5f0 = 0x11b9f2;
        uVar20 = get_line((FILE *)local_590._0_8_,local_448);
        if ((int)uVar20 < 0) goto LAB_0011b6ea;
        local_458 = 0x5552202f204d4750;
        uStack_450 = 0x44202f205942204e;
        local_468 = 0x42204e5552202f20;
        uStack_460 = 0x45544144202f2059;
LAB_0011ba6f:
        uVar18 = uStack_5bf;
        uVar17 = uStack_5c0;
        uVar16 = uStack_5c8;
        uVar15 = uStack_5d0;
        cVar14 = cStack_5d9;
        uVar13 = uStack_5e0;
        uVar12 = uStack_5e1;
        uVar11 = uStack_5e2;
        cVar10 = cStack_5e5;
        cVar9 = cStack_5e6;
        cVar8 = cStack_5e7;
        cVar7 = local_5e8;
        if (uVar20 == 0) {
LAB_0011e0df:
          uStack_5f0 = 0x11e0fa;
          local_5e8 = cVar7;
          cStack_5e7 = cVar8;
          cStack_5e6 = cVar9;
          cStack_5e5 = cVar10;
          uStack_5e2 = uVar11;
          uStack_5e1 = uVar12;
          uStack_5e0 = uVar13;
          cStack_5d9 = cVar14;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"sys",(coda_dynamic_type *)local_488,0);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = pcStack_480;
          _local_488 = auVar6 << 0x40;
          uStack_5f0 = 0x11e110;
          local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
          local_4a8._0_8_ = local_4a8._0_8_ + 1;
          uStack_5f0 = 0x11e12a;
          iVar19 = coda_mem_record_validate((coda_mem_record *)local_590._16_8_);
          if (iVar19 == 0) {
            uStack_5f0 = 0x11e13c;
            pcVar29 = coda_type_array_new(coda_format_rinex);
            uStack_5f0 = 0x11e149;
            coda_type_array_add_variable_dimension(pcVar29,(coda_expression *)0x0);
            uStack_5f0 = 0x11e15d;
            coda_type_array_set_base_type(pcVar29,(coda_type *)local_498._0_8_);
            uStack_5f0 = 0x11e167;
            pcVar26 = coda_mem_array_new(pcVar29,(coda_dynamic_type *)0x0);
            pcStack_480 = pcVar26;
            uStack_5f0 = 0x11e176;
            coda_type_release((coda_type *)pcVar29);
            uStack_5f0 = 0x11e17e;
            iVar19 = read_observation_records((ingest_info *)local_590);
LAB_0011e17e:
            if (iVar19 == 0) {
              puVar32 = (undefined8 *)(local_488 + 8);
              uStack_5f0 = 0x11e198;
              pcVar24 = coda_type_record_new(coda_format_rinex);
              uStack_5f0 = 0x11e1a5;
              pcVar30 = coda_mem_record_new(pcVar24,(coda_dynamic_type *)0x0);
              uStack_5f0 = 0x11e1b0;
              coda_type_release((coda_type *)pcVar24);
              uStack_5f0 = 0x11e1cc;
              coda_mem_record_add_field(pcVar30,"header",(coda_dynamic_type *)local_590._16_8_,1);
              local_590._16_8_ = (coda_mem_record *)0x0;
              pcVar31 = "record";
              iVar19 = 1;
              field_type_00 = (undefined1  [8])pcStack_480;
LAB_0011e1eb:
              uStack_5f0 = 0x11e1f0;
              coda_mem_record_add_field(pcVar30,pcVar31,(coda_dynamic_type *)field_type_00,iVar19);
              *puVar32 = 0;
              product->root_type = (coda_dynamic_type *)pcVar30;
              uStack_5f0 = 0x11e206;
              ingest_info_cleanup((ingest_info *)local_590);
              return 0;
            }
          }
          goto LAB_0011b6ea;
        }
        if (uVar20 < 0x3d) goto LAB_0011dcaf;
        auVar36[0] = -(local_40c == (char)local_458);
        auVar36[1] = -(cStack_40b == local_458._1_1_);
        auVar36[2] = -(cStack_40a == local_458._2_1_);
        auVar36[3] = -(cStack_409 == local_458._3_1_);
        auVar36[4] = -(cStack_408 == local_458._4_1_);
        auVar36[5] = -(cStack_407 == local_458._5_1_);
        auVar36[6] = -(cStack_406 == local_458._6_1_);
        auVar36[7] = -(cStack_405 == local_458._7_1_);
        auVar36[8] = -(cStack_404 == (char)uStack_450);
        auVar36[9] = -(cStack_403 == uStack_450._1_1_);
        auVar36[10] = -(cStack_402 == uStack_450._2_1_);
        auVar36[0xb] = -(cStack_401 == uStack_450._3_1_);
        auVar36[0xc] = -(cStack_400 == uStack_450._4_1_);
        auVar36[0xd] = -(cStack_3ff == uStack_450._5_1_);
        auVar36[0xe] = -(cStack_3fe == uStack_450._6_1_);
        auVar36[0xf] = -(cStack_3fd == uStack_450._7_1_);
        auVar68[0] = -(cStack_409 == (char)local_468);
        auVar68[1] = -(cStack_408 == local_468._1_1_);
        auVar68[2] = -(cStack_407 == local_468._2_1_);
        auVar68[3] = -(cStack_406 == local_468._3_1_);
        auVar68[4] = -(cStack_405 == local_468._4_1_);
        auVar68[5] = -(cStack_404 == local_468._5_1_);
        auVar68[6] = -(cStack_403 == local_468._6_1_);
        auVar68[7] = -(cStack_402 == local_468._7_1_);
        auVar68[8] = -(cStack_401 == (char)uStack_460);
        auVar68[9] = -(cStack_400 == uStack_460._1_1_);
        auVar68[10] = -(cStack_3ff == uStack_460._2_1_);
        auVar68[0xb] = -(cStack_3fe == uStack_460._3_1_);
        auVar68[0xc] = -(cStack_3fd == uStack_460._4_1_);
        auVar68[0xd] = -(local_3fc == uStack_460._5_1_);
        auVar68[0xe] = -(cStack_3fb == uStack_460._6_1_);
        auVar68[0xf] = -(cStack_3fa == uStack_460._7_1_);
        auVar68 = auVar68 & auVar36;
        uStack_5e2 = (undefined1)acStack_443._1_2_;
        uStack_5e1 = SUB21(acStack_443._1_2_,1);
        cStack_5d9 = (char)((ulong)stack0xfffffffffffffbc0 >> 0x38);
        uStack_5e0 = (undefined7)stack0xfffffffffffffbc0;
        local_5e8 = (char)_local_448;
        cStack_5e7 = (char)((uint)_local_448 >> 8);
        cStack_5e6 = (char)((uint)_local_448 >> 0x10);
        cStack_5e5 = (char)((uint)_local_448 >> 0x18);
        if ((ushort)((ushort)(SUB161(auVar68 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar68 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar68[0xf] >> 7) << 0xf) == 0xffff) {
          local_5d8 = (uint5)local_438;
          uStack_5f0 = 0x11c042;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c07b;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x18),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x11c091;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"program",(coda_dynamic_type *)pcVar23,0);
          local_5e8 = (char)uStack_434;
          cStack_5e7 = (char)(uStack_434 >> 8);
          cStack_5e6 = (char)(uStack_434 >> 0x10);
          cStack_5e5 = (char)(uStack_434 >> 0x18);
          cStack_5e4 = (char)uStack_430;
          cStack_5e3 = (char)((uint)uStack_430 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_430 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_430 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_428,uStack_42c);
          cStack_5d9 = (char)((uint)uStack_428 >> 0x18);
          _local_5d8 = CONCAT44(stack0xfffffffffffffa2c,uStack_424);
          uStack_5f0 = 0x11c0ac;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c0e5;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x20),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x11c0fb;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"run_by",(coda_dynamic_type *)pcVar23,0);
          local_5e8 = (char)uStack_420;
          cStack_5e7 = (char)((uint)uStack_420 >> 8);
          cStack_5e6 = (char)((uint)uStack_420 >> 0x10);
          cStack_5e5 = (char)((uint)uStack_420 >> 0x18);
          cStack_5e4 = (char)uStack_41c;
          cStack_5e3 = (char)((uint)uStack_41c >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_41c >> 0x10);
          uStack_5e1 = uStack_41c._3_1_;
          uStack_5e0 = (undefined7)
                       (CONCAT44(uStack_415,
                                 CONCAT13(cStack_416,CONCAT21(uStack_418,uStack_41c._3_1_))) >> 8);
          cStack_5d9 = '\0';
          uStack_5f0 = 0x11c12d;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x30),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x11c144;
          pcVar28 = coda_mem_time_new(*(coda_type_special **)
                                       (*(long *)(in_FS_OFFSET + -0x1c8) + 0x28),
                                      (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar23);
          uStack_5f0 = 0x11c15a;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"datetime",(coda_dynamic_type *)pcVar28,0);
          local_5e8 = (char)local_410;
          cStack_5e7 = (char)((ushort)local_410 >> 8);
          cStack_5e6 = cStack_40e;
          cStack_5e5 = 0;
          uStack_5f0 = 0x11c18c;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x38),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar31 = "datetime_time_zone";
          goto LAB_0011c627;
        }
        if (CONCAT13(cStack_406,CONCAT12(cStack_407,CONCAT11(cStack_408,cStack_409))) == 0x544e454d
            && CONCAT13(cStack_409,CONCAT12(cStack_40a,CONCAT11(cStack_40b,local_40c))) ==
               0x4d4d4f43) goto LAB_0011c631;
        uStack_5c8 = (undefined3)uStack_428;
        uStack_5d0 = (undefined3)uStack_430;
        uStack_5bf = (undefined2)((uint)uStack_420 >> 8);
        uStack_5c0 = (undefined1)uStack_420;
        if (CONCAT17(cStack_402,
                     CONCAT16(cStack_403,
                              CONCAT15(cStack_404,
                                       CONCAT14(cStack_405,
                                                CONCAT13(cStack_406,
                                                         CONCAT12(cStack_407,
                                                                  CONCAT11(cStack_408,cStack_409))))
                                      ))) == 0x454d414e2052454b &&
            CONCAT17(cStack_405,
                     CONCAT16(cStack_406,
                              CONCAT15(cStack_407,
                                       CONCAT14(cStack_408,
                                                CONCAT13(cStack_409,
                                                         CONCAT12(cStack_40a,
                                                                  CONCAT11(cStack_40b,local_40c)))))
                             )) == 0x4e2052454b52414d) {
          uStack_5b4 = CONCAT17(uStack_40d,
                                CONCAT16(cStack_40e,
                                         CONCAT24(local_410,CONCAT13(cStack_411,uStack_415._1_3_))))
          ;
          uStack_5b8 = (undefined4)
                       (CONCAT17((undefined1)uStack_415,
                                 CONCAT16(cStack_416,CONCAT24(uStack_418,uStack_41c))) >> 0x20);
          _local_5d8 = CONCAT44(uStack_434,local_438);
          uStack_5c5 = (undefined5)(CONCAT44(uStack_424,uStack_428) >> 0x18);
          uStack_5bd = (undefined1)((uint)uStack_420 >> 0x18);
          uStack_5cd = (undefined5)(CONCAT44(uStack_42c,uStack_430) >> 0x18);
          cStack_5e4 = cStack_444;
          cStack_5e3 = acStack_443[0];
          local_5ac = 0;
          uStack_5f0 = 0x11c1e3;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c21c;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x40),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar31 = "marker_name";
LAB_0011c627:
          uStack_5f0 = 0x11c631;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,pcVar31,(coda_dynamic_type *)pcVar23,0);
          cVar7 = local_5e8;
          cVar8 = cStack_5e7;
          cVar9 = cStack_5e6;
          cVar10 = cStack_5e5;
          uVar11 = uStack_5e2;
          uVar12 = uStack_5e1;
          uVar13 = uStack_5e0;
          cVar14 = cStack_5d9;
          uVar15 = uStack_5d0;
          uVar16 = uStack_5c8;
          uVar17 = uStack_5c0;
          uVar18 = uStack_5bf;
          goto LAB_0011c631;
        }
        if (CONCAT17(cStack_400,
                     CONCAT16(cStack_401,
                              CONCAT15(cStack_402,
                                       CONCAT14(cStack_403,
                                                CONCAT13(cStack_404,
                                                         CONCAT12(cStack_405,
                                                                  CONCAT11(cStack_406,cStack_407))))
                                      ))) == 0x5245424d554e2052 &&
            CONCAT17(cStack_405,
                     CONCAT16(cStack_406,
                              CONCAT15(cStack_407,
                                       CONCAT14(cStack_408,
                                                CONCAT13(cStack_409,
                                                         CONCAT12(cStack_40a,
                                                                  CONCAT11(cStack_40b,local_40c)))))
                             )) == 0x4e2052454b52414d) {
          cStack_5e4 = cStack_444;
          cStack_5e3 = acStack_443[0];
          local_5d8 = (uint5)local_438;
          uStack_5f0 = 0x11c253;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c28c;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x48),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar31 = "marker_number";
          goto LAB_0011c627;
        }
        if (CONCAT11(cStack_403,cStack_404) == 0x5059 &&
            CONCAT17(cStack_405,
                     CONCAT16(cStack_406,
                              CONCAT15(cStack_407,
                                       CONCAT14(cStack_408,
                                                CONCAT13(cStack_409,
                                                         CONCAT12(cStack_40a,
                                                                  CONCAT11(cStack_40b,local_40c)))))
                             )) == 0x542052454b52414d) {
          cStack_5e4 = cStack_444;
          cStack_5e3 = acStack_443[0];
          local_5d8 = (uint5)local_438;
          uStack_5f0 = 0x11c2c3;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c2fc;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x50),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar31 = "marker_type";
          goto LAB_0011c627;
        }
        auVar37[0] = -(local_40c == 'O');
        auVar37[1] = -(cStack_40b == 'B');
        auVar37[2] = -(cStack_40a == 'S');
        auVar37[3] = -(cStack_409 == 'E');
        auVar37[4] = -(cStack_408 == 'R');
        auVar37[5] = -(cStack_407 == 'V');
        auVar37[6] = -(cStack_406 == 'E');
        auVar37[7] = -(cStack_405 == 'R');
        auVar37[8] = -(cStack_404 == ' ');
        auVar37[9] = -(cStack_403 == '/');
        auVar37[10] = -(cStack_402 == ' ');
        auVar37[0xb] = -(cStack_401 == 'A');
        auVar37[0xc] = -(cStack_400 == 'G');
        auVar37[0xd] = -(cStack_3ff == 'E');
        auVar37[0xe] = -(cStack_3fe == 'N');
        auVar37[0xf] = -(cStack_3fd == 'C');
        auVar69[0] = -(local_3fc == 'Y');
        auVar69[1] = 0xff;
        auVar69[2] = 0xff;
        auVar69[3] = 0xff;
        auVar69[4] = 0xff;
        auVar69[5] = 0xff;
        auVar69[6] = 0xff;
        auVar69[7] = 0xff;
        auVar69[8] = 0xff;
        auVar69[9] = 0xff;
        auVar69[10] = 0xff;
        auVar69[0xb] = 0xff;
        auVar69[0xc] = 0xff;
        auVar69[0xd] = 0xff;
        auVar69[0xe] = 0xff;
        auVar69[0xf] = 0xff;
        auVar69 = auVar69 & auVar37;
        if ((ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar69[0xf] >> 7) << 0xf) == 0xffff) {
          local_5d8 = (uint5)local_438;
          uStack_5f0 = 0x11c333;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c36c;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x58),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x11c382;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"observer",(coda_dynamic_type *)pcVar23,0);
          _local_5d8 = CONCAT44(uStack_420,uStack_424);
          local_5e8 = (char)uStack_434;
          cStack_5e7 = (char)(uStack_434 >> 8);
          cStack_5e6 = (char)(uStack_434 >> 0x10);
          cStack_5e5 = (char)(uStack_434 >> 0x18);
          cStack_5e4 = (char)uStack_430;
          cStack_5e3 = (char)((uint)uStack_430 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_430 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_430 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_428,uStack_42c);
          cStack_5d9 = (char)((uint)uStack_428 >> 0x18);
          uStack_5d0 = (undefined3)uStack_41c;
          uStack_5cd = (undefined5)
                       (CONCAT17((undefined1)uStack_415,
                                 CONCAT16(cStack_416,CONCAT24(uStack_418,uStack_41c))) >> 0x18);
          uStack_5c8 = uStack_415._1_3_;
          uStack_5c5 = (undefined5)
                       (CONCAT17(uStack_40d,
                                 CONCAT16(cStack_40e,
                                          CONCAT24(local_410,CONCAT13(cStack_411,uStack_415._1_3_)))
                                ) >> 0x18);
          uStack_5c0 = 0;
          uStack_5f0 = 0x11c3af;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c3e8;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x60),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar31 = "agency";
          goto LAB_0011c627;
        }
        auVar38[0] = -(local_40c == 'R');
        auVar38[1] = -(cStack_40b == 'E');
        auVar38[2] = -(cStack_40a == 'C');
        auVar38[3] = -(cStack_409 == ' ');
        auVar38[4] = -(cStack_408 == '#');
        auVar38[5] = -(cStack_407 == ' ');
        auVar38[6] = -(cStack_406 == '/');
        auVar38[7] = -(cStack_405 == ' ');
        auVar38[8] = -(cStack_404 == 'T');
        auVar38[9] = -(cStack_403 == 'Y');
        auVar38[10] = -(cStack_402 == 'P');
        auVar38[0xb] = -(cStack_401 == 'E');
        auVar38[0xc] = -(cStack_400 == ' ');
        auVar38[0xd] = -(cStack_3ff == '/');
        auVar38[0xe] = -(cStack_3fe == ' ');
        auVar38[0xf] = -(cStack_3fd == 'V');
        auVar70[0] = -(cStack_409 == ' ');
        auVar70[1] = -(cStack_408 == '#');
        auVar70[2] = -(cStack_407 == ' ');
        auVar70[3] = -(cStack_406 == '/');
        auVar70[4] = -(cStack_405 == ' ');
        auVar70[5] = -(cStack_404 == 'T');
        auVar70[6] = -(cStack_403 == 'Y');
        auVar70[7] = -(cStack_402 == 'P');
        auVar70[8] = -(cStack_401 == 'E');
        auVar70[9] = -(cStack_400 == ' ');
        auVar70[10] = -(cStack_3ff == '/');
        auVar70[0xb] = -(cStack_3fe == ' ');
        auVar70[0xc] = -(cStack_3fd == 'V');
        auVar70[0xd] = -(local_3fc == 'E');
        auVar70[0xe] = -(cStack_3fb == 'R');
        auVar70[0xf] = -(cStack_3fa == 'S');
        auVar70 = auVar70 & auVar38;
        if ((ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar70[0xf] >> 7) << 0xf) == 0xffff) {
          local_5d8 = (uint5)local_438;
          uStack_5f0 = 0x11c41f;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c458;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x68),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x11c46e;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"receiver_number",
                     (coda_dynamic_type *)pcVar23,0);
          local_5e8 = (char)uStack_434;
          cStack_5e7 = (char)(uStack_434 >> 8);
          cStack_5e6 = (char)(uStack_434 >> 0x10);
          cStack_5e5 = (char)(uStack_434 >> 0x18);
          cStack_5e4 = (char)uStack_430;
          cStack_5e3 = (char)((uint)uStack_430 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_430 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_430 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_428,uStack_42c);
          cStack_5d9 = (char)((uint)uStack_428 >> 0x18);
          local_5d8 = (uint5)uStack_424;
          uStack_5f0 = 0x11c48e;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c4c7;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x70),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x11c4dd;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"receiver_type",
                     (coda_dynamic_type *)pcVar23,0);
          uStack_5e0 = CONCAT43(uStack_415,CONCAT12(cStack_416,uStack_418));
          local_5e8 = (char)uStack_420;
          cStack_5e7 = (char)((uint)uStack_420 >> 8);
          cStack_5e6 = (char)((uint)uStack_420 >> 0x10);
          cStack_5e5 = (char)((uint)uStack_420 >> 0x18);
          cStack_5e4 = (char)uStack_41c;
          cStack_5e3 = (char)((uint)uStack_41c >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_41c >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_41c >> 0x18);
          cStack_5d9 = cStack_411;
          local_5d8 = (uint5)CONCAT13(uStack_40d,CONCAT12(cStack_40e,local_410));
          uStack_5f0 = 0x11c4fd;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c536;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x78),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar31 = "receiver_version";
          goto LAB_0011c627;
        }
        if (CONCAT11(cStack_403,cStack_404) == 0x5954 &&
            CONCAT17(cStack_405,
                     CONCAT16(cStack_406,
                              CONCAT15(cStack_407,
                                       CONCAT14(cStack_408,
                                                CONCAT13(cStack_409,
                                                         CONCAT12(cStack_40a,
                                                                  CONCAT11(cStack_40b,local_40c)))))
                             )) == 0x202f202320544e41) {
          local_5d8 = (uint5)local_438;
          uStack_5f0 = 0x11c56d;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c5a9;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x80),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x11c5bf;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"antenna_number",
                     (coda_dynamic_type *)pcVar23,0);
          local_5e8 = (char)uStack_434;
          cStack_5e7 = (char)(uStack_434 >> 8);
          cStack_5e6 = (char)(uStack_434 >> 0x10);
          cStack_5e5 = (char)(uStack_434 >> 0x18);
          cStack_5e4 = (char)uStack_430;
          cStack_5e3 = (char)((uint)uStack_430 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_430 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_430 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_428,uStack_42c);
          cStack_5d9 = (char)((uint)uStack_428 >> 0x18);
          local_5d8 = (uint5)uStack_424;
          uStack_5f0 = 0x11c5df;
          sVar27 = strlen(&local_5e8);
          if (0 < (long)sVar27) {
            lVar21 = sVar27 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar21 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar21 + 6) = 0;
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          uStack_5f0 = 0x11c61b;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x88),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar31 = "antenna_type";
          goto LAB_0011c627;
        }
        auVar39[0] = -(local_40c == 'A');
        auVar39[1] = -(cStack_40b == 'P');
        auVar39[2] = -(cStack_40a == 'P');
        auVar39[3] = -(cStack_409 == 'R');
        auVar39[4] = -(cStack_408 == 'O');
        auVar39[5] = -(cStack_407 == 'X');
        auVar39[6] = -(cStack_406 == ' ');
        auVar39[7] = -(cStack_405 == 'P');
        auVar39[8] = -(cStack_404 == 'O');
        auVar39[9] = -(cStack_403 == 'S');
        auVar39[10] = -(cStack_402 == 'I');
        auVar39[0xb] = -(cStack_401 == 'T');
        auVar39[0xc] = -(cStack_400 == 'I');
        auVar39[0xd] = -(cStack_3ff == 'O');
        auVar39[0xe] = -(cStack_3fe == 'N');
        auVar39[0xf] = -(cStack_3fd == ' ');
        auVar71[0] = -(cStack_409 == 'R');
        auVar71[1] = -(cStack_408 == 'O');
        auVar71[2] = -(cStack_407 == 'X');
        auVar71[3] = -(cStack_406 == ' ');
        auVar71[4] = -(cStack_405 == 'P');
        auVar71[5] = -(cStack_404 == 'O');
        auVar71[6] = -(cStack_403 == 'S');
        auVar71[7] = -(cStack_402 == 'I');
        auVar71[8] = -(cStack_401 == 'T');
        auVar71[9] = -(cStack_400 == 'I');
        auVar71[10] = -(cStack_3ff == 'O');
        auVar71[0xb] = -(cStack_3fe == 'N');
        auVar71[0xc] = -(cStack_3fd == ' ');
        auVar71[0xd] = -(local_3fc == 'X');
        auVar71[0xe] = -(cStack_3fb == 'Y');
        auVar71[0xf] = -(cStack_3fa == 'Z');
        auVar71 = auVar71 & auVar39;
        if ((ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar71[0xf] >> 7) << 0xf) == 0xffff) {
          uStack_5f0 = 0x11c67f;
          local_5e8 = cVar7;
          cStack_5e7 = cVar8;
          cStack_5e6 = cVar9;
          cStack_5e5 = cVar10;
          uStack_5e2 = uVar11;
          uStack_5e1 = uVar12;
          uStack_5e0 = uVar13;
          cStack_5d9 = cVar14;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          lVar22 = coda_ascii_parse_double(local_448,0xe,(double *)&local_5a0,0);
          lVar21 = local_4a8._8_8_;
          if (lVar22 < 0) goto LAB_0011dc9c;
          uStack_5f0 = 0x11c6ad;
          pcVar23 = coda_mem_float_new(*(coda_type_number **)
                                        (*(long *)(in_FS_OFFSET + -0x1c8) + 0x90),
                                       (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                       (float)(double)CONCAT44(uStack_59c,local_5a0));
          uStack_5f0 = 0x11c6c3;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"approx_position_x",
                     (coda_dynamic_type *)pcVar23,0);
          uStack_5f0 = 0x11c6da;
          lVar21 = coda_ascii_parse_double(acStack_43a,0xe,(double *)&local_5a0,0);
          if (lVar21 < 0) {
LAB_0011df5a:
            lVar21 = local_4a8._8_8_ + 0xe;
            goto LAB_0011dc9c;
          }
          uStack_5f0 = 0x11c708;
          pcVar23 = coda_mem_float_new(*(coda_type_number **)
                                        (*(long *)(in_FS_OFFSET + -0x1c8) + 0x98),
                                       (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                       (float)(double)CONCAT44(uStack_59c,local_5a0));
          uStack_5f0 = 0x11c71e;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"approx_position_y",
                     (coda_dynamic_type *)pcVar23,0);
          uStack_5f0 = 0x11c735;
          lVar21 = coda_ascii_parse_double((char *)&uStack_42c,0xe,(double *)&local_5a0,0);
          if (lVar21 < 0) {
LAB_0011df73:
            lVar21 = local_4a8._8_8_ + 0x1c;
            goto LAB_0011dc9c;
          }
          uStack_5f0 = 0x11c763;
          pcVar23 = coda_mem_float_new(*(coda_type_number **)
                                        (*(long *)(in_FS_OFFSET + -0x1c8) + 0xa0),
                                       (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                       (float)(double)CONCAT44(uStack_59c,local_5a0));
          pcVar31 = "approx_position_z";
LAB_0011c87e:
          uStack_5f0 = 0x11c888;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,pcVar31,(coda_dynamic_type *)pcVar23,0);
          cVar7 = local_5e8;
          cVar8 = cStack_5e7;
          cVar9 = cStack_5e6;
          cVar10 = cStack_5e5;
          uVar11 = uStack_5e2;
          uVar12 = uStack_5e1;
          uVar13 = uStack_5e0;
          cVar14 = cStack_5d9;
          uVar15 = uStack_5d0;
          uVar16 = uStack_5c8;
          uVar17 = uStack_5c0;
          uVar18 = uStack_5bf;
          goto LAB_0011c631;
        }
        auVar40[0] = -(local_40c == 'A');
        auVar40[1] = -(cStack_40b == 'N');
        auVar40[2] = -(cStack_40a == 'T');
        auVar40[3] = -(cStack_409 == 'E');
        auVar40[4] = -(cStack_408 == 'N');
        auVar40[5] = -(cStack_407 == 'N');
        auVar40[6] = -(cStack_406 == 'A');
        auVar40[7] = -(cStack_405 == ':');
        auVar40[8] = -(cStack_404 == ' ');
        auVar40[9] = -(cStack_403 == 'D');
        auVar40[10] = -(cStack_402 == 'E');
        auVar40[0xb] = -(cStack_401 == 'L');
        auVar40[0xc] = -(cStack_400 == 'T');
        auVar40[0xd] = -(cStack_3ff == 'A');
        auVar40[0xe] = -(cStack_3fe == ' ');
        auVar40[0xf] = -(cStack_3fd == 'H');
        auVar72[0] = -(local_3fc == '/');
        auVar72[1] = -(cStack_3fb == 'E');
        cVar2 = (char)((uint)_local_3fc >> 0x18);
        auVar72[2] = -(cStack_3fa == '/');
        auVar72[3] = -(cVar2 == 'N');
        auVar72[4] = 0xff;
        auVar72[5] = 0xff;
        auVar72[6] = 0xff;
        auVar72[7] = 0xff;
        auVar72[8] = 0xff;
        auVar72[9] = 0xff;
        auVar72[10] = 0xff;
        auVar72[0xb] = 0xff;
        auVar72[0xc] = 0xff;
        auVar72[0xd] = 0xff;
        auVar72[0xe] = 0xff;
        auVar72[0xf] = 0xff;
        auVar72 = auVar72 & auVar40;
        if ((ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar72[0xf] >> 7) << 0xf) == 0xffff) {
          uStack_5f0 = 0x11c78e;
          local_5e8 = cVar7;
          cStack_5e7 = cVar8;
          cStack_5e6 = cVar9;
          cStack_5e5 = cVar10;
          uStack_5e2 = uVar11;
          uStack_5e1 = uVar12;
          uStack_5e0 = uVar13;
          cStack_5d9 = cVar14;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          lVar21 = coda_ascii_parse_double(local_448,0xe,(double *)&local_5a0,0);
          if (-1 < lVar21) {
            uStack_5f0 = 0x11c7bc;
            pcVar23 = coda_mem_float_new(*(coda_type_number **)
                                          (*(long *)(in_FS_OFFSET + -0x1c8) + 0xa8),
                                         (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                         (float)(double)CONCAT44(uStack_59c,local_5a0));
            uStack_5f0 = 0x11c7d2;
            coda_mem_record_add_field
                      ((coda_mem_record *)local_590._16_8_,"antenna_delta_h",
                       (coda_dynamic_type *)pcVar23,0);
            uStack_5f0 = 0x11c7e9;
            lVar21 = coda_ascii_parse_double(acStack_43a,0xe,(double *)&local_5a0,0);
            if (lVar21 < 0) goto LAB_0011df5a;
            uStack_5f0 = 0x11c817;
            pcVar23 = coda_mem_float_new(*(coda_type_number **)
                                          (*(long *)(in_FS_OFFSET + -0x1c8) + 0xb0),
                                         (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                         (float)(double)CONCAT44(uStack_59c,local_5a0));
            uStack_5f0 = 0x11c82d;
            coda_mem_record_add_field
                      ((coda_mem_record *)local_590._16_8_,"antenna_delta_e",
                       (coda_dynamic_type *)pcVar23,0);
            uStack_5f0 = 0x11c844;
            lVar21 = coda_ascii_parse_double((char *)&uStack_42c,0xe,(double *)&local_5a0,0);
            if (lVar21 < 0) goto LAB_0011df73;
            uStack_5f0 = 0x11c872;
            pcVar23 = coda_mem_float_new(*(coda_type_number **)
                                          (*(long *)(in_FS_OFFSET + -0x1c8) + 0xb8),
                                         (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                         (float)(double)CONCAT44(uStack_59c,local_5a0));
            pcVar31 = "antenna_delta_n";
            goto LAB_0011c87e;
          }
          uStack_5f0 = 0x11dfaf;
          coda_add_error_message
                    (" (line: %ld, byte offset: %ld)",local_4a8._0_8_,local_590._8_8_,
                     local_4a8._8_8_);
          goto LAB_0011b6ea;
        }
        auVar41[0] = -(local_40c == 'A');
        auVar41[1] = -(cStack_40b == 'N');
        auVar41[2] = -(cStack_40a == 'T');
        auVar41[3] = -(cStack_409 == 'E');
        auVar41[4] = -(cStack_408 == 'N');
        auVar41[5] = -(cStack_407 == 'N');
        auVar41[6] = -(cStack_406 == 'A');
        auVar41[7] = -(cStack_405 == ':');
        auVar41[8] = -(cStack_404 == ' ');
        auVar41[9] = -(cStack_403 == 'D');
        auVar41[10] = -(cStack_402 == 'E');
        auVar41[0xb] = -(cStack_401 == 'L');
        auVar41[0xc] = -(cStack_400 == 'T');
        auVar41[0xd] = -(cStack_3ff == 'A');
        auVar41[0xe] = -(cStack_3fe == ' ');
        auVar41[0xf] = -(cStack_3fd == 'X');
        auVar73[0] = -(local_3fc == '/');
        auVar73[1] = -(cStack_3fb == 'Y');
        auVar73[2] = -(cStack_3fa == '/');
        auVar73[3] = -(cVar2 == 'Z');
        auVar73[4] = 0xff;
        auVar73[5] = 0xff;
        auVar73[6] = 0xff;
        auVar73[7] = 0xff;
        auVar73[8] = 0xff;
        auVar73[9] = 0xff;
        auVar73[10] = 0xff;
        auVar73[0xb] = 0xff;
        auVar73[0xc] = 0xff;
        auVar73[0xd] = 0xff;
        auVar73[0xe] = 0xff;
        auVar73[0xf] = 0xff;
        auVar73 = auVar73 & auVar41;
        if ((((ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar73[0xf] >> 7) << 0xf) == 0xffff) ||
            (auVar42[0] = -(local_40c == 'A'), auVar42[1] = -(cStack_40b == 'N'),
            auVar42[2] = -(cStack_40a == 'T'), auVar42[3] = -(cStack_409 == 'E'),
            auVar42[4] = -(cStack_408 == 'N'), auVar42[5] = -(cStack_407 == 'N'),
            auVar42[6] = -(cStack_406 == 'A'), auVar42[7] = -(cStack_405 == ':'),
            auVar42[8] = -(cStack_404 == ' '), auVar42[9] = -(cStack_403 == 'P'),
            auVar42[10] = -(cStack_402 == 'H'), auVar42[0xb] = -(cStack_401 == 'A'),
            auVar42[0xc] = -(cStack_400 == 'S'), auVar42[0xd] = -(cStack_3ff == 'E'),
            auVar42[0xe] = -(cStack_3fe == 'C'), auVar42[0xf] = -(cStack_3fd == 'E'),
            auVar74[0] = -(local_3fc == 'N'), auVar74[1] = -(cStack_3fb == 'T'),
            auVar74[2] = -(cStack_3fa == 'E'), auVar74[3] = -(cVar2 == 'R'), auVar74[4] = 0xff,
            auVar74[5] = 0xff, auVar74[6] = 0xff, auVar74[7] = 0xff, auVar74[8] = 0xff,
            auVar74[9] = 0xff, auVar74[10] = 0xff, auVar74[0xb] = 0xff, auVar74[0xc] = 0xff,
            auVar74[0xd] = 0xff, auVar74[0xe] = 0xff, auVar74[0xf] = 0xff,
            auVar74 = auVar74 & auVar42,
            (ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar74[0xf] >> 7) << 0xf) == 0xffff)) ||
           (((auVar43[0] = -(local_40c == 'A'), auVar43[1] = -(cStack_40b == 'N'),
             auVar43[2] = -(cStack_40a == 'T'), auVar43[3] = -(cStack_409 == 'E'),
             auVar43[4] = -(cStack_408 == 'N'), auVar43[5] = -(cStack_407 == 'N'),
             auVar43[6] = -(cStack_406 == 'A'), auVar43[7] = -(cStack_405 == ':'),
             auVar43[8] = -(cStack_404 == ' '), auVar43[9] = -(cStack_403 == 'B'),
             auVar43[10] = -(cStack_402 == '.'), auVar43[0xb] = -(cStack_401 == 'S'),
             auVar43[0xc] = -(cStack_400 == 'I'), auVar43[0xd] = -(cStack_3ff == 'G'),
             auVar43[0xe] = -(cStack_3fe == 'H'), auVar43[0xf] = -(cStack_3fd == 'T'),
             auVar75[0] = -(local_3fc == ' '), auVar75[1] = -(cStack_3fb == 'X'),
             auVar75[2] = -(cStack_3fa == 'Y'), auVar75[3] = -(cVar2 == 'Z'), auVar75[4] = 0xff,
             auVar75[5] = 0xff, auVar75[6] = 0xff, auVar75[7] = 0xff, auVar75[8] = 0xff,
             auVar75[9] = 0xff, auVar75[10] = 0xff, auVar75[0xb] = 0xff, auVar75[0xc] = 0xff,
             auVar75[0xd] = 0xff, auVar75[0xe] = 0xff, auVar75[0xf] = 0xff,
             auVar75 = auVar75 & auVar43,
             (ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar75[0xf] >> 7) << 0xf) == 0xffff ||
             ((auVar44[0] = -(local_40c == 'A'), auVar44[1] = -(cStack_40b == 'N'),
              auVar44[2] = -(cStack_40a == 'T'), auVar44[3] = -(cStack_409 == 'E'),
              auVar44[4] = -(cStack_408 == 'N'), auVar44[5] = -(cStack_407 == 'N'),
              auVar44[6] = -(cStack_406 == 'A'), auVar44[7] = -(cStack_405 == ':'),
              auVar44[8] = -(cStack_404 == ' '), auVar44[9] = -(cStack_403 == 'Z'),
              auVar44[10] = -(cStack_402 == 'E'), auVar44[0xb] = -(cStack_401 == 'R'),
              auVar44[0xc] = -(cStack_400 == 'O'), auVar44[0xd] = -(cStack_3ff == 'D'),
              auVar44[0xe] = -(cStack_3fe == 'I'), auVar44[0xf] = -(cStack_3fd == 'R'),
              auVar76[0] = -(local_3fc == ' '), auVar76[1] = -(cStack_3fb == 'A'),
              auVar76[2] = -(cStack_3fa == 'Z'), auVar76[3] = -(cVar2 == 'I'), auVar76[4] = 0xff,
              auVar76[5] = 0xff, auVar76[6] = 0xff, auVar76[7] = 0xff, auVar76[8] = 0xff,
              auVar76[9] = 0xff, auVar76[10] = 0xff, auVar76[0xb] = 0xff, auVar76[0xc] = 0xff,
              auVar76[0xd] = 0xff, auVar76[0xe] = 0xff, auVar76[0xf] = 0xff,
              auVar76 = auVar76 & auVar44,
              (ushort)((ushort)(SUB161(auVar76 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar76[0xf] >> 7) << 0xf) == 0xffff ||
              (auVar77[0] = -(local_40c == 'A'), auVar77[1] = -(cStack_40b == 'N'),
              auVar77[2] = -(cStack_40a == 'T'), auVar77[3] = -(cStack_409 == 'E'),
              auVar77[4] = -(cStack_408 == 'N'), auVar77[5] = -(cStack_407 == 'N'),
              auVar77[6] = -(cStack_406 == 'A'), auVar77[7] = -(cStack_405 == ':'),
              auVar77[8] = -(cStack_404 == ' '), auVar77[9] = -(cStack_403 == 'Z'),
              auVar77[10] = -(cStack_402 == 'E'), auVar77[0xb] = -(cStack_401 == 'R'),
              auVar77[0xc] = -(cStack_400 == 'O'), auVar77[0xd] = -(cStack_3ff == 'D'),
              auVar77[0xe] = -(cStack_3fe == 'I'), auVar77[0xf] = -(cStack_3fd == 'R'),
              auVar45[0] = -(local_3fc == ' '), auVar45[1] = -(cStack_3fb == 'X'),
              auVar45[2] = -(cStack_3fa == 'Y'), auVar45[3] = -(cVar2 == 'Z'), auVar45[4] = 0xff,
              auVar45[5] = 0xff, auVar45[6] = 0xff, auVar45[7] = 0xff, auVar45[8] = 0xff,
              auVar45[9] = 0xff, auVar45[10] = 0xff, auVar45[0xb] = 0xff, auVar45[0xc] = 0xff,
              auVar45[0xd] = 0xff, auVar45[0xe] = 0xff, auVar45[0xf] = 0xff,
              auVar45 = auVar45 & auVar77,
              (ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) == 0xffff)))) ||
            (auVar46[0] = -(local_40c == 'C'), auVar46[1] = -(cStack_40b == 'E'),
            auVar46[2] = -(cStack_40a == 'N'), auVar46[3] = -(cStack_409 == 'T'),
            auVar46[4] = -(cStack_408 == 'E'), auVar46[5] = -(cStack_407 == 'R'),
            auVar46[6] = -(cStack_406 == ' '), auVar46[7] = -(cStack_405 == 'O'),
            auVar46[8] = -(cStack_404 == 'F'), auVar46[9] = -(cStack_403 == ' '),
            auVar46[10] = -(cStack_402 == 'M'), auVar46[0xb] = -(cStack_401 == 'A'),
            auVar46[0xc] = -(cStack_400 == 'S'), auVar46[0xd] = -(cStack_3ff == 'S'),
            auVar46[0xe] = -(cStack_3fe == ':'), auVar46[0xf] = -(cStack_3fd == ' '),
            auVar78[0] = -(cStack_409 == 'T'), auVar78[1] = -(cStack_408 == 'E'),
            auVar78[2] = -(cStack_407 == 'R'), auVar78[3] = -(cStack_406 == ' '),
            auVar78[4] = -(cStack_405 == 'O'), auVar78[5] = -(cStack_404 == 'F'),
            auVar78[6] = -(cStack_403 == ' '), auVar78[7] = -(cStack_402 == 'M'),
            auVar78[8] = -(cStack_401 == 'A'), auVar78[9] = -(cStack_400 == 'S'),
            auVar78[10] = -(cStack_3ff == 'S'), auVar78[0xb] = -(cStack_3fe == ':'),
            auVar78[0xc] = -(cStack_3fd == ' '), auVar78[0xd] = -(local_3fc == 'X'),
            auVar78[0xe] = -(cStack_3fb == 'Y'), auVar78[0xf] = -(cStack_3fa == 'Z'),
            auVar78 = auVar78 & auVar46,
            (ushort)((ushort)(SUB161(auVar78 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar78[0xf] >> 7) << 0xf) == 0xffff)))) goto LAB_0011c631;
        auVar47[0] = -(local_40c == 'S');
        auVar47[1] = -(cStack_40b == 'Y');
        auVar47[2] = -(cStack_40a == 'S');
        auVar47[3] = -(cStack_409 == ' ');
        auVar47[4] = -(cStack_408 == '/');
        auVar47[5] = -(cStack_407 == ' ');
        auVar47[6] = -(cStack_406 == '#');
        auVar47[7] = -(cStack_405 == ' ');
        auVar47[8] = -(cStack_404 == '/');
        auVar47[9] = -(cStack_403 == ' ');
        auVar47[10] = -(cStack_402 == 'O');
        auVar47[0xb] = -(cStack_401 == 'B');
        auVar47[0xc] = -(cStack_400 == 'S');
        auVar47[0xd] = -(cStack_3ff == ' ');
        auVar47[0xe] = -(cStack_3fe == 'T');
        auVar47[0xf] = -(cStack_3fd == 'Y');
        auVar79[0] = -(cStack_409 == ' ');
        auVar79[1] = -(cStack_408 == '/');
        auVar79[2] = -(cStack_407 == ' ');
        auVar79[3] = -(cStack_406 == '#');
        auVar79[4] = -(cStack_405 == ' ');
        auVar79[5] = -(cStack_404 == '/');
        auVar79[6] = -(cStack_403 == ' ');
        auVar79[7] = -(cStack_402 == 'O');
        auVar79[8] = -(cStack_401 == 'B');
        auVar79[9] = -(cStack_400 == 'S');
        auVar79[10] = -(cStack_3ff == ' ');
        auVar79[0xb] = -(cStack_3fe == 'T');
        auVar79[0xc] = -(cStack_3fd == 'Y');
        auVar79[0xd] = -(local_3fc == 'P');
        auVar79[0xe] = -(cStack_3fb == 'E');
        auVar79[0xf] = -(cStack_3fa == 'S');
        auVar79 = auVar79 & auVar47;
        if ((ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar79 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar79[0xf] >> 7) << 0xf) == 0xffff) {
          uStack_5f0 = 0x11c89f;
          local_5e8 = cVar7;
          cStack_5e7 = cVar8;
          cStack_5e6 = cVar9;
          cStack_5e5 = cVar10;
          uStack_5e2 = uVar11;
          uStack_5e1 = uVar12;
          uStack_5e0 = uVar13;
          cStack_5d9 = cVar14;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          iVar19 = handle_observation_definition((ingest_info *)local_590,local_448);
          cVar7 = local_5e8;
          cVar8 = cStack_5e7;
          cVar9 = cStack_5e6;
          cVar10 = cStack_5e5;
          uVar11 = uStack_5e2;
          uVar12 = uStack_5e1;
          uVar13 = uStack_5e0;
          cVar14 = cStack_5d9;
          uVar15 = uStack_5d0;
          uVar16 = uStack_5c8;
          uVar17 = uStack_5c0;
          uVar18 = uStack_5bf;
          if (iVar19 != 0) goto LAB_0011b6ea;
          goto LAB_0011c631;
        }
        auVar48[0] = -(local_40c == 'S');
        auVar48[1] = -(cStack_40b == 'I');
        auVar48[2] = -(cStack_40a == 'G');
        auVar48[3] = -(cStack_409 == 'N');
        auVar48[4] = -(cStack_408 == 'A');
        auVar48[5] = -(cStack_407 == 'L');
        auVar48[6] = -(cStack_406 == ' ');
        auVar48[7] = -(cStack_405 == 'S');
        auVar48[8] = -(cStack_404 == 'T');
        auVar48[9] = -(cStack_403 == 'R');
        auVar48[10] = -(cStack_402 == 'E');
        auVar48[0xb] = -(cStack_401 == 'N');
        auVar48[0xc] = -(cStack_400 == 'G');
        auVar48[0xd] = -(cStack_3ff == 'T');
        auVar48[0xe] = -(cStack_3fe == 'H');
        auVar48[0xf] = -(cStack_3fd == ' ');
        auVar80[0] = -(local_3fc == 'U');
        auVar80[1] = -(cStack_3fb == 'N');
        auVar80[2] = -(cStack_3fa == 'I');
        auVar80[3] = -(cVar2 == 'T');
        auVar80[4] = 0xff;
        auVar80[5] = 0xff;
        auVar80[6] = 0xff;
        auVar80[7] = 0xff;
        auVar80[8] = 0xff;
        auVar80[9] = 0xff;
        auVar80[10] = 0xff;
        auVar80[0xb] = 0xff;
        auVar80[0xc] = 0xff;
        auVar80[0xd] = 0xff;
        auVar80[0xe] = 0xff;
        auVar80[0xf] = 0xff;
        auVar80 = auVar80 & auVar48;
        if ((ushort)((ushort)(SUB161(auVar80 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar80 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar80 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar80 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar80 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar80 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar80 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar80 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar80 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar80 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar80[0xf] >> 7) << 0xf) == 0xffff) {
          cStack_5e4 = cStack_444;
          cStack_5e3 = acStack_443[0];
          local_5d8 = (uint5)local_438;
          uStack_5f0 = 0x11c8e1;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          rtrim(&local_5e8);
          uStack_5f0 = 0x11c900;
          pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x108),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar31 = "signal_strength_unit";
        }
        else if (CONCAT17(cStack_405,
                          CONCAT16(cStack_406,
                                   CONCAT15(cStack_407,
                                            CONCAT14(cStack_408,
                                                     CONCAT13(cStack_409,
                                                              CONCAT12(cStack_40a,
                                                                       CONCAT11(cStack_40b,local_40c
                                                                               ))))))) ==
                 0x4c41565245544e49) {
          uStack_5f0 = 0x11c925;
          local_5e8 = cVar7;
          cStack_5e7 = cVar8;
          cStack_5e6 = cVar9;
          cStack_5e5 = cVar10;
          uStack_5e2 = uVar11;
          uStack_5e1 = uVar12;
          uStack_5e0 = uVar13;
          cStack_5d9 = cVar14;
          uStack_5d0 = uVar15;
          uStack_5c8 = uVar16;
          uStack_5c0 = uVar17;
          uStack_5bf = uVar18;
          lVar22 = coda_ascii_parse_double(local_448,10,(double *)&local_5a0,0);
          lVar21 = local_4a8._8_8_;
          if (lVar22 < 0) goto LAB_0011dc9c;
          uStack_5f0 = 0x11c950;
          pcVar23 = coda_mem_double_new(*(coda_type_number **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x110),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        (double)CONCAT44(uStack_59c,local_5a0));
          pcVar31 = "obs_interval";
        }
        else {
          auVar49[0] = -(local_40c == 'T');
          auVar49[1] = -(cStack_40b == 'I');
          auVar49[2] = -(cStack_40a == 'M');
          auVar49[3] = -(cStack_409 == 'E');
          auVar49[4] = -(cStack_408 == ' ');
          auVar49[5] = -(cStack_407 == 'O');
          auVar49[6] = -(cStack_406 == 'F');
          auVar49[7] = -(cStack_405 == ' ');
          auVar49[8] = -(cStack_404 == 'F');
          auVar49[9] = -(cStack_403 == 'I');
          auVar49[10] = -(cStack_402 == 'R');
          auVar49[0xb] = -(cStack_401 == 'S');
          auVar49[0xc] = -(cStack_400 == 'T');
          auVar49[0xd] = -(cStack_3ff == ' ');
          auVar49[0xe] = -(cStack_3fe == 'O');
          auVar49[0xf] = -(cStack_3fd == 'B');
          auVar81[0] = -(local_3fc == 'S');
          auVar81[1] = 0xff;
          auVar81[2] = 0xff;
          auVar81[3] = 0xff;
          auVar81[4] = 0xff;
          auVar81[5] = 0xff;
          auVar81[6] = 0xff;
          auVar81[7] = 0xff;
          auVar81[8] = 0xff;
          auVar81[9] = 0xff;
          auVar81[10] = 0xff;
          auVar81[0xb] = 0xff;
          auVar81[0xc] = 0xff;
          auVar81[0xd] = 0xff;
          auVar81[0xe] = 0xff;
          auVar81[0xf] = 0xff;
          auVar81 = auVar81 & auVar49;
          if ((ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar81[0xf] >> 7) << 0xf) == 0xffff) {
            uStack_5c5 = CONCAT41(uStack_424,uStack_428._3_1_);
            _local_5d8 = CONCAT44(uStack_434,local_438);
            uStack_5cd = (undefined5)(CONCAT44(uStack_42c,uStack_430) >> 0x18);
            cStack_5e4 = cStack_444;
            cStack_5e3 = acStack_443[0];
            uStack_5bd = 0;
            uStack_5f0 = 0x11c9b2;
            pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                           (*(long *)(in_FS_OFFSET + -0x1c8) + 0x120),
                                          (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                          &local_5e8);
            uStack_5f0 = 0x11c9cc;
            pcVar28 = coda_mem_time_new(*(coda_type_special **)
                                         (*(long *)(in_FS_OFFSET + -0x1c8) + 0x118),
                                        (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar23);
            uStack_5f0 = 0x11c9e2;
            coda_mem_record_add_field
                      ((coda_mem_record *)local_590._16_8_,"time_of_first_obs",
                       (coda_dynamic_type *)pcVar28,0);
            local_5e8 = (char)uStack_418;
            cStack_5e7 = (char)((ushort)uStack_418 >> 8);
            cStack_5e6 = cStack_416;
            if (CONCAT12(cStack_416,uStack_418) == 0x202020) {
              if (cStack_4af == 'E') {
                local_5e8 = 'G';
                cStack_5e7 = 'A';
                cStack_5e6 = 'L';
              }
              else if (cStack_4af == 'R') {
                local_5e8 = 'G';
                cStack_5e7 = 'L';
                cStack_5e6 = 'O';
              }
              else if (cStack_4af == 'G') {
                local_5e8 = 'G';
                cStack_5e7 = 'P';
                cStack_5e6 = 'S';
              }
            }
            cStack_5e5 = 0;
            uStack_5f0 = 0x11cb82;
            pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                           (*(long *)(in_FS_OFFSET + -0x1c8) + 0x138),
                                          (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                          &local_5e8);
            pcVar31 = "time_of_first_obs_time_zone";
          }
          else {
            auVar50[0] = -(local_40c == 'T');
            auVar50[1] = -(cStack_40b == 'I');
            auVar50[2] = -(cStack_40a == 'M');
            auVar50[3] = -(cStack_409 == 'E');
            auVar50[4] = -(cStack_408 == ' ');
            auVar50[5] = -(cStack_407 == 'O');
            auVar50[6] = -(cStack_406 == 'F');
            auVar50[7] = -(cStack_405 == ' ');
            auVar50[8] = -(cStack_404 == 'L');
            auVar50[9] = -(cStack_403 == 'A');
            auVar50[10] = -(cStack_402 == 'S');
            auVar50[0xb] = -(cStack_401 == 'T');
            auVar50[0xc] = -(cStack_400 == ' ');
            auVar50[0xd] = -(cStack_3ff == 'O');
            auVar50[0xe] = -(cStack_3fe == 'B');
            auVar50[0xf] = -(cStack_3fd == 'S');
            if ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar50[0xf] >> 7) << 0xf) == 0xffff) {
              uStack_5c5 = CONCAT41(uStack_424,uStack_428._3_1_);
              _local_5d8 = CONCAT44(uStack_434,local_438);
              uStack_5cd = (undefined5)(CONCAT44(uStack_42c,uStack_430) >> 0x18);
              cStack_5e4 = cStack_444;
              cStack_5e3 = acStack_443[0];
              uStack_5bd = 0;
              uStack_5f0 = 0x11ca85;
              pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                             (*(long *)(in_FS_OFFSET + -0x1c8) + 0x130),
                                            (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_
                                            ,&local_5e8);
              uStack_5f0 = 0x11ca9f;
              pcVar28 = coda_mem_time_new(*(coda_type_special **)
                                           (*(long *)(in_FS_OFFSET + -0x1c8) + 0x128),
                                          (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar23);
              uStack_5f0 = 0x11cab5;
              coda_mem_record_add_field
                        ((coda_mem_record *)local_590._16_8_,"time_of_last_obs",
                         (coda_dynamic_type *)pcVar28,0);
              local_5e8 = (char)uStack_418;
              cStack_5e7 = (char)((ushort)uStack_418 >> 8);
              cStack_5e6 = cStack_416;
              if (CONCAT12(cStack_416,uStack_418) == 0x202020) {
                if (cStack_4af == 'E') {
                  local_5e8 = 'G';
                  cStack_5e7 = 'A';
                  cStack_5e6 = 'L';
                }
                else if (cStack_4af == 'R') {
                  local_5e8 = 'G';
                  cStack_5e7 = 'L';
                  cStack_5e6 = 'O';
                }
                else if (cStack_4af == 'G') {
                  local_5e8 = 'G';
                  cStack_5e7 = 'P';
                  cStack_5e6 = 'S';
                }
              }
              cStack_5e5 = 0;
              uStack_5f0 = 0x11cbbf;
              pcVar23 = coda_mem_string_new(*(coda_type_text **)
                                             (*(long *)(in_FS_OFFSET + -0x1c8) + 0x138),
                                            (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_
                                            ,&local_5e8);
              pcVar31 = "time_of_last_obs_time_zone";
            }
            else {
              auVar51[0] = -(local_40c == 'R');
              auVar51[1] = -(cStack_40b == 'C');
              auVar51[2] = -(cStack_40a == 'V');
              auVar51[3] = -(cStack_409 == ' ');
              auVar51[4] = -(cStack_408 == 'C');
              auVar51[5] = -(cStack_407 == 'L');
              auVar51[6] = -(cStack_406 == 'O');
              auVar51[7] = -(cStack_405 == 'C');
              auVar51[8] = -(cStack_404 == 'K');
              auVar51[9] = -(cStack_403 == ' ');
              auVar51[10] = -(cStack_402 == 'O');
              auVar51[0xb] = -(cStack_401 == 'F');
              auVar51[0xc] = -(cStack_400 == 'F');
              auVar51[0xd] = -(cStack_3ff == 'S');
              auVar51[0xe] = -(cStack_3fe == ' ');
              auVar51[0xf] = -(cStack_3fd == 'A');
              auVar82[0] = -(cStack_409 == ' ');
              auVar82[1] = -(cStack_408 == 'C');
              auVar82[2] = -(cStack_407 == 'L');
              auVar82[3] = -(cStack_406 == 'O');
              auVar82[4] = -(cStack_405 == 'C');
              auVar82[5] = -(cStack_404 == 'K');
              auVar82[6] = -(cStack_403 == ' ');
              auVar82[7] = -(cStack_402 == 'O');
              auVar82[8] = -(cStack_401 == 'F');
              auVar82[9] = -(cStack_400 == 'F');
              auVar82[10] = -(cStack_3ff == 'S');
              auVar82[0xb] = -(cStack_3fe == ' ');
              auVar82[0xc] = -(cStack_3fd == 'A');
              auVar82[0xd] = -(local_3fc == 'P');
              auVar82[0xe] = -(cStack_3fb == 'P');
              auVar82[0xf] = -(cStack_3fa == 'L');
              auVar82 = auVar82 & auVar51;
              if ((ushort)((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar82[0xf] >> 7) << 0xf) == 0xffff) {
                uStack_5f0 = 0x11cb1b;
                local_5e8 = cVar7;
                cStack_5e7 = cVar8;
                cStack_5e6 = cVar9;
                cStack_5e5 = cVar10;
                uStack_5e2 = uVar11;
                uStack_5e1 = uVar12;
                uStack_5e0 = uVar13;
                cStack_5d9 = cVar14;
                uStack_5d0 = uVar15;
                uStack_5c8 = uVar16;
                uStack_5c0 = uVar17;
                uStack_5bf = uVar18;
                lVar22 = coda_ascii_parse_int64(local_448,6,(int64_t *)local_598,0);
                lVar21 = local_4a8._8_8_;
                if (lVar22 < 0) goto LAB_0011dc9c;
                uStack_5f0 = 0x11cb45;
                pcVar23 = coda_mem_uint8_new(*(coda_type_number **)
                                              (*(long *)(in_FS_OFFSET + -0x1c8) + 0x140),
                                             (coda_dynamic_type *)0x0,
                                             (coda_product *)local_590._8_8_,(uint8_t)local_598[0]);
                pcVar31 = "rcv_clock_offs_appl";
              }
              else {
                auVar52[0] = -(local_40c == 'S');
                auVar52[1] = -(cStack_40b == 'Y');
                auVar52[2] = -(cStack_40a == 'S');
                auVar52[3] = -(cStack_409 == ' ');
                auVar52[4] = -(cStack_408 == '/');
                auVar52[5] = -(cStack_407 == ' ');
                auVar52[6] = -(cStack_406 == 'D');
                auVar52[7] = -(cStack_405 == 'C');
                auVar52[8] = -(cStack_404 == 'B');
                auVar52[9] = -(cStack_403 == 'S');
                auVar52[10] = -(cStack_402 == ' ');
                auVar52[0xb] = -(cStack_401 == 'A');
                auVar52[0xc] = -(cStack_400 == 'P');
                auVar52[0xd] = -(cStack_3ff == 'P');
                auVar52[0xe] = -(cStack_3fe == 'L');
                auVar52[0xf] = -(cStack_3fd == 'I');
                auVar83[0] = -(local_3fc == 'E');
                auVar83[1] = -(cStack_3fb == 'D');
                auVar83[2] = 0xff;
                auVar83[3] = 0xff;
                auVar83[4] = 0xff;
                auVar83[5] = 0xff;
                auVar83[6] = 0xff;
                auVar83[7] = 0xff;
                auVar83[8] = 0xff;
                auVar83[9] = 0xff;
                auVar83[10] = 0xff;
                auVar83[0xb] = 0xff;
                auVar83[0xc] = 0xff;
                auVar83[0xd] = 0xff;
                auVar83[0xe] = 0xff;
                auVar83[0xf] = 0xff;
                auVar83 = auVar83 & auVar52;
                if ((((ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar83 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar83[0xf] >> 7) << 0xf) == 0xffff) ||
                    (auVar53[0] = -(local_40c == 'S'), auVar53[1] = -(cStack_40b == 'Y'),
                    auVar53[2] = -(cStack_40a == 'S'), auVar53[3] = -(cStack_409 == ' '),
                    auVar53[4] = -(cStack_408 == '/'), auVar53[5] = -(cStack_407 == ' '),
                    auVar53[6] = -(cStack_406 == 'P'), auVar53[7] = -(cStack_405 == 'C'),
                    auVar53[8] = -(cStack_404 == 'V'), auVar53[9] = -(cStack_403 == 'S'),
                    auVar53[10] = -(cStack_402 == ' '), auVar53[0xb] = -(cStack_401 == 'A'),
                    auVar53[0xc] = -(cStack_400 == 'P'), auVar53[0xd] = -(cStack_3ff == 'P'),
                    auVar53[0xe] = -(cStack_3fe == 'L'), auVar53[0xf] = -(cStack_3fd == 'I'),
                    auVar84[0] = -(local_3fc == 'E'), auVar84[1] = -(cStack_3fb == 'D'),
                    auVar84[2] = 0xff, auVar84[3] = 0xff, auVar84[4] = 0xff, auVar84[5] = 0xff,
                    auVar84[6] = 0xff, auVar84[7] = 0xff, auVar84[8] = 0xff, auVar84[9] = 0xff,
                    auVar84[10] = 0xff, auVar84[0xb] = 0xff, auVar84[0xc] = 0xff,
                    auVar84[0xd] = 0xff, auVar84[0xe] = 0xff, auVar84[0xf] = 0xff,
                    auVar84 = auVar84 & auVar53,
                    (ushort)((ushort)(SUB161(auVar84 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar84[0xf] >> 7) << 0xf) == 0xffff)) ||
                   (auVar54[0] = -(local_40c == 'S'), auVar54[1] = -(cStack_40b == 'Y'),
                   auVar54[2] = -(cStack_40a == 'S'), auVar54[3] = -(cStack_409 == ' '),
                   auVar54[4] = -(cStack_408 == '/'), auVar54[5] = -(cStack_407 == ' '),
                   auVar54[6] = -(cStack_406 == 'S'), auVar54[7] = -(cStack_405 == 'C'),
                   auVar54[8] = -(cStack_404 == 'A'), auVar54[9] = -(cStack_403 == 'L'),
                   auVar54[10] = -(cStack_402 == 'E'), auVar54[0xb] = -(cStack_401 == ' '),
                   auVar54[0xc] = -(cStack_400 == 'F'), auVar54[0xd] = -(cStack_3ff == 'A'),
                   auVar54[0xe] = -(cStack_3fe == 'C'), auVar54[0xf] = -(cStack_3fd == 'T'),
                   auVar85[0] = -(local_3fc == 'O'), auVar85[1] = -(cStack_3fb == 'R'),
                   auVar85[2] = 0xff, auVar85[3] = 0xff, auVar85[4] = 0xff, auVar85[5] = 0xff,
                   auVar85[6] = 0xff, auVar85[7] = 0xff, auVar85[8] = 0xff, auVar85[9] = 0xff,
                   auVar85[10] = 0xff, auVar85[0xb] = 0xff, auVar85[0xc] = 0xff, auVar85[0xd] = 0xff
                   , auVar85[0xe] = 0xff, auVar85[0xf] = 0xff, auVar85 = auVar85 & auVar54,
                   (ushort)((ushort)(SUB161(auVar85 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar85 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar85 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar85 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar85 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar85 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar85 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar85 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar85 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar85 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar85 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar85 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar85 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar85[0xf] >> 7) << 0xf) == 0xffff)) goto LAB_0011c631;
                if (CONCAT13(cStack_401,CONCAT12(cStack_402,CONCAT11(cStack_403,cStack_404))) ==
                    0x53444e4f &&
                    CONCAT17(cStack_405,
                             CONCAT16(cStack_406,
                                      CONCAT15(cStack_407,
                                               CONCAT14(cStack_408,
                                                        CONCAT13(cStack_409,
                                                                 CONCAT12(cStack_40a,
                                                                          CONCAT11(cStack_40b,
                                                                                   local_40c)))))))
                    == 0x434553205041454c) {
                  uStack_5f0 = 0x11cbf8;
                  local_5e8 = cVar7;
                  cStack_5e7 = cVar8;
                  cStack_5e6 = cVar9;
                  cStack_5e5 = cVar10;
                  uStack_5e2 = uVar11;
                  uStack_5e1 = uVar12;
                  uStack_5e0 = uVar13;
                  cStack_5d9 = cVar14;
                  uStack_5d0 = uVar15;
                  uStack_5c8 = uVar16;
                  uStack_5c0 = uVar17;
                  uStack_5bf = uVar18;
                  lVar22 = coda_ascii_parse_int64(local_448,6,(int64_t *)local_598,0);
                  lVar21 = local_4a8._8_8_;
                  if (lVar22 < 0) goto LAB_0011dc9c;
                  uStack_5f0 = 0x11cc21;
                  pcVar23 = coda_mem_int32_new(*(coda_type_number **)
                                                (*(long *)(in_FS_OFFSET + -0x1c8) + 0x148),
                                               (coda_dynamic_type *)0x0,
                                               (coda_product *)local_590._8_8_,local_598[0]);
                  pcVar31 = "leap_seconds";
                }
                else {
                  if (CONCAT17(cStack_3fe,
                               CONCAT16(cStack_3ff,
                                        CONCAT15(cStack_400,
                                                 CONCAT14(cStack_401,
                                                          CONCAT13(cStack_402,
                                                                   CONCAT12(cStack_403,
                                                                            CONCAT11(cStack_404,
                                                                                     cStack_405)))))
                                       )) != 0x534554494c4c4554 ||
                      CONCAT17(cStack_405,
                               CONCAT16(cStack_406,
                                        CONCAT15(cStack_407,
                                                 CONCAT14(cStack_408,
                                                          CONCAT13(cStack_409,
                                                                   CONCAT12(cStack_40a,
                                                                            CONCAT11(cStack_40b,
                                                                                     local_40c))))))
                              ) != 0x54415320464f2023) {
                    if (CONCAT17(cStack_3ff,
                                 CONCAT16(cStack_400,
                                          CONCAT15(cStack_401,
                                                   CONCAT14(cStack_402,
                                                            CONCAT13(cStack_403,
                                                                     CONCAT12(cStack_404,
                                                                              CONCAT11(cStack_405,
                                                                                       cStack_406)))
                                                           )))) == 0x53424f20464f2023 &&
                        CONCAT17(cStack_405,
                                 CONCAT16(cStack_406,
                                          CONCAT15(cStack_407,
                                                   CONCAT14(cStack_408,
                                                            CONCAT13(cStack_409,
                                                                     CONCAT12(cStack_40a,
                                                                              CONCAT11(cStack_40b,
                                                                                       local_40c))))
                                                  ))) == 0x2023202f204e5250) goto LAB_0011c631;
                    local_5e8 = cVar7;
                    cStack_5e7 = cVar8;
                    cStack_5e6 = cVar9;
                    cStack_5e5 = cVar10;
                    uStack_5e2 = uVar11;
                    uStack_5e1 = uVar12;
                    uStack_5e0 = uVar13;
                    cStack_5d9 = cVar14;
                    uStack_5d0 = uVar15;
                    uStack_5c8 = uVar16;
                    uStack_5c0 = uVar17;
                    uStack_5bf = uVar18;
                    if (CONCAT17(cStack_400,
                                 CONCAT16(cStack_401,
                                          CONCAT15(cStack_402,
                                                   CONCAT14(cStack_403,
                                                            CONCAT13(cStack_404,
                                                                     CONCAT12(cStack_405,
                                                                              CONCAT11(cStack_406,
                                                                                       cStack_407)))
                                                           )))) == 0x5245444145482046 &&
                        CONCAT17(cStack_405,
                                 CONCAT16(cStack_406,
                                          CONCAT15(cStack_407,
                                                   CONCAT14(cStack_408,
                                                            CONCAT13(cStack_409,
                                                                     CONCAT12(cStack_40a,
                                                                              CONCAT11(cStack_40b,
                                                                                       local_40c))))
                                                  ))) == 0x4820464f20444e45) goto LAB_0011e0df;
LAB_0011dfdd:
                    pcVar31 = &local_40c;
                    message = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
                    lVar21 = local_4a8._8_8_ + 0x3c;
                    goto LAB_0011b6e3;
                  }
                  uStack_5f0 = 0x11cc43;
                  local_5e8 = cVar7;
                  cStack_5e7 = cVar8;
                  cStack_5e6 = cVar9;
                  cStack_5e5 = cVar10;
                  uStack_5e2 = uVar11;
                  uStack_5e1 = uVar12;
                  uStack_5e0 = uVar13;
                  cStack_5d9 = cVar14;
                  uStack_5d0 = uVar15;
                  uStack_5c8 = uVar16;
                  uStack_5c0 = uVar17;
                  uStack_5bf = uVar18;
                  lVar22 = coda_ascii_parse_int64(local_448,6,(int64_t *)local_598,0);
                  lVar21 = local_4a8._8_8_;
                  if (lVar22 < 0) goto LAB_0011dc9c;
                  uStack_5f0 = 0x11cc6d;
                  pcVar23 = coda_mem_uint16_new(*(coda_type_number **)
                                                 (*(long *)(in_FS_OFFSET + -0x1c8) + 0x150),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,
                                                (uint16_t)local_598[0]);
                  pcVar31 = "num_satellites";
                }
              }
            }
          }
        }
        uStack_5f0 = 0x11cbd5;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,pcVar31,(coda_dynamic_type *)pcVar23,0);
        cVar7 = local_5e8;
        cVar8 = cStack_5e7;
        cVar9 = cStack_5e6;
        cVar10 = cStack_5e5;
        uVar11 = uStack_5e2;
        uVar12 = uStack_5e1;
        uVar13 = uStack_5e0;
        cVar14 = cStack_5d9;
        uVar15 = uStack_5d0;
        uVar16 = uStack_5c8;
        uVar17 = uStack_5c0;
        uVar18 = uStack_5bf;
LAB_0011c631:
        uStack_5bf = uVar18;
        uStack_5c0 = uVar17;
        uStack_5c8 = uVar16;
        uStack_5d0 = uVar15;
        cStack_5d9 = cVar14;
        uStack_5e0 = uVar13;
        uStack_5e1 = uVar12;
        uStack_5e2 = uVar11;
        cStack_5e5 = cVar10;
        cStack_5e6 = cVar9;
        cStack_5e7 = cVar8;
        local_5e8 = cVar7;
        uStack_5f0 = 0x11c63b;
        local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
        local_4a8._0_8_ = local_4a8._0_8_ + 1;
        uStack_5f0 = 0x11c658;
        uVar20 = get_line((FILE *)local_590._0_8_,local_448);
        if ((int)uVar20 < 0) goto LAB_0011b6ea;
        goto LAB_0011ba6f;
      }
      pcVar31 = "RINEX format version %3.2f is not supported for Clock data";
    }
    else if (uVar20 == 0x4e) {
      if ((dStack_4b8 == 3.0) && (!NAN(dStack_4b8))) {
        lVar21 = 0x3f8;
        goto LAB_0011b7f3;
      }
      pcVar31 = "RINEX format version %3.2f is not supported for Navigation data";
    }
    else {
      if (uVar20 != 0x4f) {
        uStack_5f0 = 0x11b7e2;
        coda_set_error(-200,"RINEX file type \'%c\' is not supported",
                       (ulong)(uint)(int)(char)uStack_434);
        goto LAB_0011b6ea;
      }
      if ((dStack_4b8 == 3.0) && (!NAN(dStack_4b8))) {
        lVar21 = 0x1a8;
        goto LAB_0011b7f3;
      }
      pcVar31 = "RINEX format version %3.2f is not supported for Observation data";
    }
    uStack_5f0 = 0x11b7c7;
    coda_set_error(-200,pcVar31);
    goto LAB_0011b6ea;
  }
  pcVar31 = &local_40c;
  lVar21 = local_4a8._8_8_ + 0x3c;
  message = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
LAB_0011b6e3:
  uStack_5f0 = 0x11b6ea;
  coda_set_error(-0x16,message,pcVar31,local_4a8._0_8_,lVar21);
LAB_0011b6ea:
  uStack_5f0 = 0x11b6f4;
  ingest_info_cleanup((ingest_info *)local_590);
  return -1;
LAB_0011dcaf:
  pcVar31 = (char *)(ulong)uVar20;
LAB_0011b659:
  message = "header line length (%ld) too short (line: %ld, byte offset: %ld)";
  lVar21 = local_4a8._8_8_;
  goto LAB_0011b6e3;
}

Assistant:

static int read_file(coda_product *product)
{
    coda_type_array *records_definition;
    coda_type_record_field *field;
    coda_type_record *definition;
    coda_mem_record *root_type = NULL;
    ingest_info info;

    ingest_info_init(&info);
    info.product = product;

    info.f = fopen(product->filename, "r");
    if (info.f == NULL)
    {
        coda_set_error(CODA_ERROR_FILE_OPEN, "could not open file %s", product->filename);
        return -1;
    }

    if (read_main_header(&info) != 0)
    {
        ingest_info_cleanup(&info);
        return -1;
    }

    if (info.file_type == 'O')
    {
        info.epoch_record_definition = coda_type_record_new(coda_format_rinex);
        field = coda_type_record_field_new("epoch");
        coda_type_record_field_set_type(field, rinex_type[rinex_obs_epoch]);
        coda_type_record_add_field(info.epoch_record_definition, field);
        field = coda_type_record_field_new("flag");
        coda_type_record_field_set_type(field, rinex_type[rinex_obs_epoch_flag]);
        coda_type_record_add_field(info.epoch_record_definition, field);
        field = coda_type_record_field_new("receiver_clock_offset");
        coda_type_record_field_set_type(field, rinex_type[rinex_receiver_clock_offset]);
        coda_type_record_add_field(info.epoch_record_definition, field);

        if (read_observation_header(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }
        if (coda_mem_record_validate(info.header) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create /record array */
        records_definition = coda_type_array_new(coda_format_rinex);
        coda_type_array_add_variable_dimension((coda_type_array *)records_definition, NULL);
        coda_type_array_set_base_type(records_definition, (coda_type *)info.epoch_record_definition);
        info.records = coda_mem_array_new(records_definition, NULL);
        coda_type_release((coda_type *)records_definition);

        if (read_observation_records(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create root record */
        definition = coda_type_record_new(coda_format_rinex);
        root_type = coda_mem_record_new(definition, NULL);
        coda_type_release((coda_type *)definition);
        coda_mem_record_add_field(root_type, "header", (coda_dynamic_type *)info.header, 1);
        info.header = NULL;
        coda_mem_record_add_field(root_type, "record", (coda_dynamic_type *)info.records, 1);
        info.records = NULL;
    }
    else if (info.file_type == 'N')
    {
        info.epoch_record_definition = coda_type_record_new(coda_format_rinex);
        field = coda_type_record_field_new("epoch");
        coda_type_record_field_set_type(field, rinex_type[rinex_obs_epoch]);
        coda_type_record_add_field(info.epoch_record_definition, field);
        field = coda_type_record_field_new("flag");
        coda_type_record_field_set_type(field, rinex_type[rinex_obs_epoch_flag]);
        coda_type_record_add_field(info.epoch_record_definition, field);
        field = coda_type_record_field_new("receiver_clock_offset");
        coda_type_record_field_set_type(field, rinex_type[rinex_receiver_clock_offset]);
        coda_type_record_add_field(info.epoch_record_definition, field);

        if (read_navigation_header(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }
        if (coda_mem_record_validate(info.header) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        info.gps.records = coda_mem_array_new((coda_type_array *)rinex_type[rinex_nav_gps_array], NULL);
        info.glonass.records = coda_mem_array_new((coda_type_array *)rinex_type[rinex_nav_glonass_array], NULL);
        info.galileo.records = coda_mem_array_new((coda_type_array *)rinex_type[rinex_nav_galileo_array], NULL);
        info.sbas.records = coda_mem_array_new((coda_type_array *)rinex_type[rinex_nav_sbas_array], NULL);

        if (read_navigation_records(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create root record */
        root_type = coda_mem_record_new((coda_type_record *)rinex_type[rinex_nav_file], NULL);
        coda_mem_record_add_field(root_type, "header", (coda_dynamic_type *)info.header, 0);
        info.header = NULL;
        coda_mem_record_add_field(root_type, "gps", (coda_dynamic_type *)info.gps.records, 0);
        info.gps.records = NULL;
        coda_mem_record_add_field(root_type, "glonass", (coda_dynamic_type *)info.glonass.records, 0);
        info.glonass.records = NULL;
        coda_mem_record_add_field(root_type, "galileo", (coda_dynamic_type *)info.galileo.records, 0);
        info.galileo.records = NULL;
        coda_mem_record_add_field(root_type, "sbas", (coda_dynamic_type *)info.sbas.records, 0);
        info.sbas.records = NULL;
    }
    else        /* file_type == 'C' */
    {
        if (read_clock_header(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }
        if (coda_mem_record_validate(info.header) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create /record array */
        records_definition = coda_type_array_new(coda_format_rinex);
        coda_type_array_add_variable_dimension((coda_type_array *)records_definition, NULL);
        coda_type_array_set_base_type(records_definition, rinex_type[rinex_clk_record]);
        info.records = coda_mem_array_new(records_definition, NULL);
        coda_type_release((coda_type *)records_definition);

        if (read_clock_records(&info) != 0)
        {
            ingest_info_cleanup(&info);
            return -1;
        }

        /* create root record */
        definition = coda_type_record_new(coda_format_rinex);
        root_type = coda_mem_record_new(definition, NULL);
        coda_type_release((coda_type *)definition);
        coda_mem_record_add_field(root_type, "header", (coda_dynamic_type *)info.header, 1);
        info.header = NULL;
        coda_mem_record_add_field(root_type, "record", (coda_dynamic_type *)info.records, 1);
        info.records = NULL;
    }

    product->root_type = (coda_dynamic_type *)root_type;

    ingest_info_cleanup(&info);

    return 0;
}